

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Sigmoid_x86_avx2::forward_inplace(Sigmoid_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [24];
  undefined1 (*pauVar46) [32];
  long in_RSI;
  double dVar47;
  float fVar48;
  float fVar49;
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m256 one_4;
  __m256 one;
  __m128 one_6;
  __m128 one_2;
  __m256 pow2n;
  __m256 y;
  __m256 z;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 pow2n_2;
  __m256 y_2;
  __m256 z_2;
  __m256 mask_2;
  __m256 one_5;
  __m256i imm0_1;
  __m256 fx_2;
  __m256 tmp_2;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf z_1;
  v4sf mask_1;
  v4sf one_3;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n_3;
  v4sf y_3;
  v4sf z_3;
  v4sf mask_3;
  v4sf one_7;
  v4si emm0_1;
  v4sf fx_3;
  v4sf tmp_3;
  undefined8 in_stack_ffffffffffffde68;
  Mat *this_00;
  Mat *in_stack_ffffffffffffde70;
  int local_212c;
  Mat local_2128;
  undefined1 (*local_20e0) [32];
  int local_20d4;
  void *local_20d0;
  int *piStack_20c8;
  int local_20bc;
  Mat local_20b8;
  Mat *local_2070;
  int local_2064;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  int local_2028;
  Mat local_2018;
  undefined1 (*local_1fd0) [32];
  int local_1fc8;
  int local_1fc4;
  int local_1fc0;
  int local_1fbc;
  int local_1fb8;
  int local_1fb4;
  undefined1 (*local_1f90) [32];
  undefined1 (*local_1f88) [32];
  undefined1 local_1f80 [32];
  undefined1 (*local_1f48) [32];
  undefined1 local_1f40 [32];
  undefined1 (*local_1f08) [32];
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined1 (*local_1e80) [32];
  Mat *local_1e78;
  undefined1 local_1e70 [16];
  undefined1 (*local_1e58) [32];
  undefined1 local_1e50 [16];
  Mat *local_1e38;
  undefined8 local_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 local_1e10;
  undefined8 uStack_1e08;
  void *local_1e00;
  int *piStack_1df8;
  undefined4 local_1de8;
  undefined4 local_1de4;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  undefined1 local_1d80 [32];
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined1 local_1d00 [8];
  float fStack_1cf8;
  float fStack_1cf4;
  float fStack_1cf0;
  float fStack_1cec;
  float fStack_1ce8;
  float fStack_1ce4;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  float local_1cc0;
  float fStack_1cbc;
  float fStack_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  float fStack_1ca8;
  float fStack_1ca4;
  float local_1ca0;
  float fStack_1c9c;
  float fStack_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  float fStack_1c88;
  float fStack_1c84;
  undefined1 local_1c80 [32];
  undefined4 local_1c60;
  undefined4 uStack_1c5c;
  undefined4 uStack_1c58;
  undefined4 uStack_1c54;
  undefined4 uStack_1c50;
  undefined4 uStack_1c4c;
  undefined4 uStack_1c48;
  undefined4 uStack_1c44;
  undefined1 local_1c40 [32];
  undefined1 local_1c20 [8];
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined1 local_1c00 [8];
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined1 local_1be0 [32];
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined4 local_1b40;
  undefined4 uStack_1b3c;
  undefined4 uStack_1b38;
  undefined4 uStack_1b34;
  undefined4 uStack_1b30;
  undefined4 uStack_1b2c;
  undefined4 uStack_1b28;
  undefined4 uStack_1b24;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined4 local_1b00;
  undefined4 uStack_1afc;
  undefined4 uStack_1af8;
  undefined4 uStack_1af4;
  undefined4 uStack_1af0;
  undefined4 uStack_1aec;
  undefined4 uStack_1ae8;
  undefined4 uStack_1ae4;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined4 local_1ac0;
  undefined4 uStack_1abc;
  undefined4 uStack_1ab8;
  undefined4 uStack_1ab4;
  undefined4 uStack_1ab0;
  undefined4 uStack_1aac;
  undefined4 uStack_1aa8;
  undefined4 uStack_1aa4;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined4 local_1a80;
  undefined4 uStack_1a7c;
  undefined4 uStack_1a78;
  undefined4 uStack_1a74;
  undefined4 uStack_1a70;
  undefined4 uStack_1a6c;
  undefined4 uStack_1a68;
  undefined4 uStack_1a64;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined4 local_1a40;
  undefined4 uStack_1a3c;
  undefined4 uStack_1a38;
  undefined4 uStack_1a34;
  undefined4 uStack_1a30;
  undefined4 uStack_1a2c;
  undefined4 uStack_1a28;
  undefined4 uStack_1a24;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined4 local_1a00;
  undefined4 uStack_19fc;
  undefined4 uStack_19f8;
  undefined4 uStack_19f4;
  undefined4 uStack_19f0;
  undefined4 uStack_19ec;
  undefined4 uStack_19e8;
  undefined4 uStack_19e4;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  float local_1980;
  float fStack_197c;
  float fStack_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  float fStack_1968;
  float fStack_1964;
  undefined1 local_1960 [32];
  undefined4 local_1940;
  undefined4 uStack_193c;
  undefined4 uStack_1938;
  undefined4 uStack_1934;
  undefined4 uStack_1930;
  undefined4 uStack_192c;
  undefined4 uStack_1928;
  undefined4 uStack_1924;
  undefined1 local_1920 [32];
  undefined1 local_1900 [8];
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined1 local_18e0 [8];
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined1 local_18c0 [32];
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined4 local_1820;
  undefined4 uStack_181c;
  undefined4 uStack_1818;
  undefined4 uStack_1814;
  undefined4 uStack_1810;
  undefined4 uStack_180c;
  undefined4 uStack_1808;
  undefined4 uStack_1804;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined4 local_17e0;
  undefined4 uStack_17dc;
  undefined4 uStack_17d8;
  undefined4 uStack_17d4;
  undefined4 uStack_17d0;
  undefined4 uStack_17cc;
  undefined4 uStack_17c8;
  undefined4 uStack_17c4;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined4 local_17a0;
  undefined4 uStack_179c;
  undefined4 uStack_1798;
  undefined4 uStack_1794;
  undefined4 uStack_1790;
  undefined4 uStack_178c;
  undefined4 uStack_1788;
  undefined4 uStack_1784;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined4 local_1760;
  undefined4 uStack_175c;
  undefined4 uStack_1758;
  undefined4 uStack_1754;
  undefined4 uStack_1750;
  undefined4 uStack_174c;
  undefined4 uStack_1748;
  undefined4 uStack_1744;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined4 local_1720;
  undefined4 uStack_171c;
  undefined4 uStack_1718;
  undefined4 uStack_1714;
  undefined4 uStack_1710;
  undefined4 uStack_170c;
  undefined4 uStack_1708;
  undefined4 uStack_1704;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined4 local_16e0;
  undefined4 uStack_16dc;
  undefined4 uStack_16d8;
  undefined4 uStack_16d4;
  undefined4 uStack_16d0;
  undefined4 uStack_16cc;
  undefined4 uStack_16c8;
  undefined4 uStack_16c4;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  ulong uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  ulong uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [16];
  undefined1 auStack_1410 [16];
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  undefined4 local_13f0;
  undefined4 local_13ec;
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined1 local_13e0 [16];
  undefined1 auStack_13d0 [16];
  undefined4 local_13c0;
  undefined4 local_13bc;
  undefined4 local_13b8;
  undefined4 local_13b4;
  undefined4 local_13b0;
  undefined4 local_13ac;
  undefined4 local_13a8;
  undefined4 local_13a4;
  undefined4 local_13a0;
  undefined4 uStack_139c;
  undefined4 uStack_1398;
  undefined4 uStack_1394;
  undefined4 uStack_1390;
  undefined4 uStack_138c;
  undefined4 uStack_1388;
  undefined4 uStack_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined4 local_1360;
  undefined4 uStack_135c;
  undefined4 uStack_1358;
  undefined4 uStack_1354;
  undefined4 uStack_1350;
  undefined4 uStack_134c;
  undefined4 uStack_1348;
  undefined4 uStack_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined4 local_1320;
  undefined4 uStack_131c;
  undefined4 uStack_1318;
  undefined4 uStack_1314;
  undefined4 uStack_1310;
  undefined4 uStack_130c;
  undefined4 uStack_1308;
  undefined4 uStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined4 local_12e0;
  undefined4 uStack_12dc;
  undefined4 uStack_12d8;
  undefined4 uStack_12d4;
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined1 local_1280 [32];
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined4 local_10a0;
  undefined4 uStack_109c;
  undefined4 uStack_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 uStack_1088;
  undefined4 uStack_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined4 local_de0;
  undefined4 uStack_ddc;
  undefined4 uStack_dd8;
  undefined4 uStack_dd4;
  undefined4 uStack_dd0;
  undefined4 uStack_dcc;
  undefined4 uStack_dc8;
  undefined4 uStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined4 local_da0;
  undefined4 uStack_d9c;
  undefined4 uStack_d98;
  undefined4 uStack_d94;
  undefined4 uStack_d90;
  undefined4 uStack_d8c;
  undefined4 uStack_d88;
  undefined4 uStack_d84;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined4 local_d60;
  undefined4 uStack_d5c;
  undefined4 uStack_d58;
  undefined4 uStack_d54;
  undefined4 uStack_d50;
  undefined4 uStack_d4c;
  undefined4 uStack_d48;
  undefined4 uStack_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined4 local_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined4 local_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined4 local_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined4 local_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined4 local_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  undefined4 local_9d4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [16];
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [16];
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined8 local_970;
  undefined8 uStack_968;
  undefined1 local_960 [16];
  undefined8 local_950;
  undefined8 uStack_948;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined4 local_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 local_8d0 [16];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined4 local_840;
  undefined4 uStack_83c;
  undefined4 uStack_838;
  undefined4 uStack_834;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined4 local_7e0;
  undefined4 uStack_7dc;
  undefined4 uStack_7d8;
  undefined4 uStack_7d4;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  undefined1 local_790 [16];
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined1 local_740 [16];
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined4 local_6f0;
  undefined4 uStack_6ec;
  undefined4 uStack_6e8;
  undefined4 uStack_6e4;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined4 local_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined4 local_6b0;
  undefined4 uStack_6ac;
  undefined4 uStack_6a8;
  undefined4 uStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined4 local_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined4 local_670;
  undefined4 uStack_66c;
  undefined4 uStack_668;
  undefined4 uStack_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined4 local_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  void *local_570;
  int *piStack_568;
  undefined8 local_560;
  ulong uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  ulong uStack_538;
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined4 local_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined4 local_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined4 local_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined1 local_460 [16];
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_300 [16];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1fb4 = *(int *)(in_RSI + 0x2c);
  local_1fb8 = *(int *)(in_RSI + 0x30);
  local_1fbc = *(int *)(in_RSI + 0x38);
  local_1fc0 = local_1fb4 * local_1fb8;
  local_1fc4 = *(int *)(in_RSI + 0x18);
  if (local_1fc4 == 8) {
    local_1fc4 = 8;
    for (local_1fc8 = 0; local_1fc8 < local_1fbc; local_1fc8 = local_1fc8 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffde70,(int)((ulong)in_stack_ffffffffffffde68 >> 0x20));
      pauVar46 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_2018);
      ncnn::Mat::~Mat((Mat *)0x5014e4);
      local_1fd0 = pauVar46;
      for (local_2028 = 0; local_2028 < local_1fc0; local_2028 = local_2028 + 1) {
        local_1f88 = local_1fd0;
        local_2060 = *(undefined8 *)*local_1fd0;
        uStack_2058 = *(undefined8 *)(*local_1fd0 + 8);
        uStack_2050 = *(undefined8 *)(*local_1fd0 + 0x10);
        uStack_2048 = *(undefined8 *)(*local_1fd0 + 0x18);
        local_1f08 = local_1fd0;
        local_1de8 = 0x3f800000;
        local_13c0 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_13e0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_13d0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_1ec0 = local_13e0._0_8_;
        uStack_1eb8 = local_13e0._8_8_;
        uStack_1eb0 = auStack_13d0._0_8_;
        uStack_1ea8 = auStack_13d0._8_8_;
        local_1dc0 = local_13e0._0_8_;
        uStack_1db8 = local_13e0._8_8_;
        uStack_1db0 = auStack_13d0._0_8_;
        uStack_1da8 = auStack_13d0._8_8_;
        local_1480 = ZEXT832(0) << 0x20;
        local_1500 = 0;
        local_1460._8_8_ = SUB328(ZEXT832(0),4);
        uStack_14f8 = local_1460._8_8_;
        uStack_14f0 = 0;
        uStack_14e8 = 0;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_1460._8_8_) << 0x40,*local_1fd0);
        local_1c60 = 0x3f800000;
        uStack_1c5c = 0x3f800000;
        uStack_1c58 = 0x3f800000;
        uStack_1c54 = 0x3f800000;
        uStack_1c50 = 0x3f800000;
        uStack_1c4c = 0x3f800000;
        uStack_1c48 = 0x3f800000;
        uStack_1c44 = 0x3f800000;
        local_1be0._0_8_ = auVar6._0_8_;
        local_1340 = local_1be0._0_8_;
        local_1be0._8_8_ = auVar6._8_8_;
        uStack_1338 = local_1be0._8_8_;
        local_1be0._16_8_ = auVar6._16_8_;
        uStack_1330 = local_1be0._16_8_;
        local_1be0._24_8_ = auVar6._24_8_;
        uStack_1328 = local_1be0._24_8_;
        local_1360 = 0x42b0c0a5;
        uStack_135c = 0x42b0c0a5;
        uStack_1358 = 0x42b0c0a5;
        uStack_1354 = 0x42b0c0a5;
        uStack_1350 = 0x42b0c0a5;
        uStack_134c = 0x42b0c0a5;
        uStack_1348 = 0x42b0c0a5;
        uStack_1344 = 0x42b0c0a5;
        auVar16._8_4_ = 0x42b0c0a5;
        auVar16._0_8_ = 0x42b0c0a542b0c0a5;
        auVar16._12_4_ = 0x42b0c0a5;
        auVar16._16_4_ = 0x42b0c0a5;
        auVar16._20_4_ = 0x42b0c0a5;
        auVar16._24_4_ = 0x42b0c0a5;
        auVar16._28_4_ = 0x42b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar16);
        local_1be0._0_8_ = auVar6._0_8_;
        local_12c0 = local_1be0._0_8_;
        local_1be0._8_8_ = auVar6._8_8_;
        uStack_12b8 = local_1be0._8_8_;
        local_1be0._16_8_ = auVar6._16_8_;
        uStack_12b0 = local_1be0._16_8_;
        local_1be0._24_8_ = auVar6._24_8_;
        uStack_12a8 = local_1be0._24_8_;
        local_12e0 = 0xc2b0c0a5;
        uStack_12dc = 0xc2b0c0a5;
        uStack_12d8 = 0xc2b0c0a5;
        uStack_12d4 = 0xc2b0c0a5;
        uStack_12d0 = 0xc2b0c0a5;
        uStack_12cc = 0xc2b0c0a5;
        uStack_12c8 = 0xc2b0c0a5;
        uStack_12c4 = 0xc2b0c0a5;
        auVar18._8_4_ = 0xc2b0c0a5;
        auVar18._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar18._12_4_ = 0xc2b0c0a5;
        auVar18._16_4_ = 0xc2b0c0a5;
        auVar18._20_4_ = 0xc2b0c0a5;
        auVar18._24_4_ = 0xc2b0c0a5;
        auVar18._28_4_ = 0xc2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar18);
        local_1be0._0_8_ = auVar4._0_8_;
        uVar7 = local_1be0._0_8_;
        local_1be0._8_8_ = auVar4._8_8_;
        uVar8 = local_1be0._8_8_;
        local_1be0._16_8_ = auVar4._16_8_;
        uVar9 = local_1be0._16_8_;
        local_1be0._24_8_ = auVar4._24_8_;
        uVar10 = local_1be0._24_8_;
        local_d60 = 0x3fb8aa3b;
        uStack_d5c = 0x3fb8aa3b;
        uStack_d58 = 0x3fb8aa3b;
        uStack_d54 = 0x3fb8aa3b;
        uStack_d50 = 0x3fb8aa3b;
        uStack_d4c = 0x3fb8aa3b;
        uStack_d48 = 0x3fb8aa3b;
        uStack_d44 = 0x3fb8aa3b;
        local_d40._0_4_ = auVar4._0_4_;
        local_d40._4_4_ = auVar4._4_4_;
        uStack_d38._0_4_ = auVar4._8_4_;
        uStack_d38._4_4_ = auVar4._12_4_;
        uStack_d30._0_4_ = auVar4._16_4_;
        uStack_d30._4_4_ = auVar4._20_4_;
        uStack_d28._0_4_ = auVar4._24_4_;
        uStack_d28._4_4_ = auVar4._28_4_;
        local_1c20._4_4_ = local_d40._4_4_ * 1.442695;
        local_1c20._0_4_ = (float)local_d40 * 1.442695;
        uStack_1c18._0_4_ = (float)uStack_d38 * 1.442695;
        uStack_1c18._4_4_ = uStack_d38._4_4_ * 1.442695;
        uStack_1c10._0_4_ = (float)uStack_d30 * 1.442695;
        uStack_1c10._4_4_ = uStack_d30._4_4_ * 1.442695;
        auVar45 = _local_1c20;
        uStack_1c08._0_4_ = (float)uStack_d28 * 1.442695;
        uStack_1c08._4_4_ = uStack_d28._4_4_;
        auVar6 = _local_1c20;
        local_19e0 = local_1c20;
        uStack_19d8 = uStack_1c18;
        uStack_1c10 = auVar45._16_8_;
        uStack_19d0 = uStack_1c10;
        uStack_1c08 = auVar6._24_8_;
        uStack_19c8 = uStack_1c08;
        local_1a00 = 0x3f000000;
        uStack_19fc = 0x3f000000;
        uStack_19f8 = 0x3f000000;
        uStack_19f4 = 0x3f000000;
        uStack_19f0 = 0x3f000000;
        uStack_19ec = 0x3f000000;
        uStack_19e8 = 0x3f000000;
        uStack_19e4 = 0x3f000000;
        local_1c20._4_4_ = local_d40._4_4_ * 1.442695 + 0.5;
        local_1c20._0_4_ = (float)local_d40 * 1.442695 + 0.5;
        uStack_1c18._0_4_ = (float)uStack_d38 * 1.442695 + 0.5;
        uStack_1c18._4_4_ = uStack_d38._4_4_ * 1.442695 + 0.5;
        uStack_1c10._0_4_ = (float)uStack_d30 * 1.442695 + 0.5;
        uStack_1c10._4_4_ = uStack_d30._4_4_ * 1.442695 + 0.5;
        uStack_1c08._0_4_ = (float)uStack_d28 * 1.442695 + 0.5;
        uStack_1c08._4_4_ = uStack_d28._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1c20,1);
        auVar6 = vcmpps_avx(_local_1c20,auVar5,1);
        local_1c80._0_8_ = auVar6._0_8_;
        local_cc0 = local_1c80._0_8_;
        local_1c80._8_8_ = auVar6._8_8_;
        uStack_cb8 = local_1c80._8_8_;
        local_1c80._16_8_ = auVar6._16_8_;
        uStack_cb0 = local_1c80._16_8_;
        local_1c80._24_8_ = auVar6._24_8_;
        uStack_ca8 = local_1c80._24_8_;
        local_ce0 = 0x3f8000003f800000;
        uStack_cd8 = 0x3f8000003f800000;
        uStack_cd0 = 0x3f8000003f800000;
        uStack_cc8 = 0x3f8000003f800000;
        auVar20._8_8_ = 0x3f8000003f800000;
        auVar20._0_8_ = 0x3f8000003f800000;
        auVar20._16_8_ = 0x3f8000003f800000;
        auVar20._24_8_ = 0x3f8000003f800000;
        local_1c80 = vpand_avx2(auVar6,auVar20);
        local_1c00 = auVar5._0_8_;
        local_1540 = local_1c00;
        uStack_1bf8 = auVar5._8_8_;
        uStack_1538 = uStack_1bf8;
        uStack_1bf0 = auVar5._16_8_;
        uStack_1530 = uStack_1bf0;
        uStack_1be8 = auVar5._24_8_;
        uStack_1528 = uStack_1be8;
        local_1560 = local_1c80._0_8_;
        uStack_1558 = local_1c80._8_8_;
        uStack_1550 = local_1c80._16_8_;
        uStack_1548 = local_1c80._24_8_;
        _local_1c20 = vsubps_avx(auVar5,local_1c80);
        local_da0 = 0x3f318000;
        uStack_d9c = 0x3f318000;
        uStack_d98 = 0x3f318000;
        uStack_d94 = 0x3f318000;
        uStack_d90 = 0x3f318000;
        uStack_d8c = 0x3f318000;
        uStack_d88 = 0x3f318000;
        uStack_d84 = 0x3f318000;
        local_d80._0_4_ = local_1c20._0_4_;
        local_d80._4_4_ = local_1c20._4_4_;
        uStack_d78._0_4_ = local_1c20._8_4_;
        uStack_d78._4_4_ = local_1c20._12_4_;
        uStack_d70._0_4_ = local_1c20._16_4_;
        uStack_d70._4_4_ = local_1c20._20_4_;
        uStack_d68._0_4_ = local_1c20._24_4_;
        uStack_d68._4_4_ = local_1c20._28_4_;
        local_1c00._4_4_ = local_d80._4_4_ * 0.6933594;
        local_1c00._0_4_ = (float)local_d80 * 0.6933594;
        uStack_1bf8._0_4_ = (float)uStack_d78 * 0.6933594;
        uStack_1bf8._4_4_ = uStack_d78._4_4_ * 0.6933594;
        uStack_1bf0._0_4_ = (float)uStack_d70 * 0.6933594;
        uStack_1bf0._4_4_ = uStack_d70._4_4_ * 0.6933594;
        auVar45 = _local_1c00;
        uStack_1be8._0_4_ = (float)uStack_d68 * 0.6933594;
        uStack_1be8._4_4_ = uStack_d68._4_4_;
        auVar5 = _local_1c00;
        local_dc0 = local_1c20;
        uStack_db8 = uStack_1c18;
        uStack_db0 = uStack_1c10;
        uStack_da8 = uStack_1c08;
        local_de0 = 0xb95e8083;
        uStack_ddc = 0xb95e8083;
        uStack_dd8 = 0xb95e8083;
        uStack_dd4 = 0xb95e8083;
        uStack_dd0 = 0xb95e8083;
        uStack_dcc = 0xb95e8083;
        uStack_dc8 = 0xb95e8083;
        uStack_dc4 = 0xb95e8083;
        local_1580 = local_1be0._0_8_;
        uStack_1578 = local_1be0._8_8_;
        uStack_1570 = local_1be0._16_8_;
        uStack_1568 = local_1be0._24_8_;
        local_15a0 = local_1c00;
        uStack_1598 = uStack_1bf8;
        uStack_1bf0 = auVar45._16_8_;
        uStack_1590 = uStack_1bf0;
        uStack_1be8 = auVar5._24_8_;
        uStack_1588 = uStack_1be8;
        auVar14._16_8_ = uStack_1bf0;
        auVar14._0_16_ = _local_1c00;
        auVar14._24_8_ = uStack_1be8;
        auVar6 = vsubps_avx(auVar4,auVar14);
        local_1be0._0_8_ = auVar6._0_8_;
        local_15c0 = local_1be0._0_8_;
        local_1be0._8_8_ = auVar6._8_8_;
        uStack_15b8 = local_1be0._8_8_;
        local_1be0._16_8_ = auVar6._16_8_;
        uStack_15b0 = local_1be0._16_8_;
        local_1be0._24_8_ = auVar6._24_8_;
        uStack_15a8 = local_1be0._24_8_;
        local_15e0 = CONCAT44(local_d80._4_4_ * -0.00021219444,(float)local_d80 * -0.00021219444);
        uStack_15d8 = CONCAT44(uStack_d78._4_4_ * -0.00021219444,(float)uStack_d78 * -0.00021219444)
        ;
        uStack_15d0 = CONCAT44(uStack_d70._4_4_ * -0.00021219444,(float)uStack_d70 * -0.00021219444)
        ;
        uStack_15c8 = CONCAT44(uStack_d68._4_4_,(float)uStack_d68 * -0.00021219444);
        auVar13._8_8_ = uStack_15d8;
        auVar13._0_8_ = local_15e0;
        auVar13._16_8_ = uStack_15d0;
        auVar13._24_8_ = uStack_15c8;
        local_1be0 = vsubps_avx(auVar6,auVar13);
        local_e20 = local_1be0._0_8_;
        uStack_e18 = local_1be0._8_8_;
        uStack_e10 = local_1be0._16_8_;
        uStack_e08 = local_1be0._24_8_;
        local_e00._0_4_ = local_1be0._0_4_;
        local_e00._4_4_ = local_1be0._4_4_;
        uStack_df8._0_4_ = local_1be0._8_4_;
        uStack_df8._4_4_ = local_1be0._12_4_;
        uStack_df0._0_4_ = local_1be0._16_4_;
        uStack_df0._4_4_ = local_1be0._20_4_;
        uStack_de8._0_4_ = local_1be0._24_4_;
        uStack_de8._4_4_ = local_1be0._28_4_;
        fStack_1c84 = uStack_de8._4_4_;
        local_1ca0 = (float)local_e00 * (float)local_e00;
        fStack_1c9c = local_e00._4_4_ * local_e00._4_4_;
        fStack_1c98 = (float)uStack_df8 * (float)uStack_df8;
        fStack_1c94 = uStack_df8._4_4_ * uStack_df8._4_4_;
        fStack_1c90 = (float)uStack_df0 * (float)uStack_df0;
        fStack_1c8c = uStack_df0._4_4_ * uStack_df0._4_4_;
        fStack_1c88 = (float)uStack_de8 * (float)uStack_de8;
        local_e40 = 0x3950696739506967;
        uStack_e38 = 0x3950696739506967;
        uStack_e30 = 0x3950696739506967;
        uStack_e28 = 0x3950696739506967;
        local_e60 = local_1be0._0_8_;
        uStack_e58 = local_1be0._8_8_;
        uStack_e50 = local_1be0._16_8_;
        uStack_e48 = local_1be0._24_8_;
        local_1a20 = CONCAT44(local_e00._4_4_ * 0.00019875691,(float)local_e00 * 0.00019875691);
        uStack_1a18 = CONCAT44(uStack_df8._4_4_ * 0.00019875691,(float)uStack_df8 * 0.00019875691);
        uStack_1a10 = CONCAT44(uStack_df0._4_4_ * 0.00019875691,(float)uStack_df0 * 0.00019875691);
        uStack_1a08 = CONCAT44(0x39506967,(float)uStack_de8 * 0.00019875691);
        local_1a40 = 0x3ab743ce;
        uStack_1a3c = 0x3ab743ce;
        uStack_1a38 = 0x3ab743ce;
        uStack_1a34 = 0x3ab743ce;
        uStack_1a30 = 0x3ab743ce;
        uStack_1a2c = 0x3ab743ce;
        uStack_1a28 = 0x3ab743ce;
        uStack_1a24 = 0x3ab743ce;
        local_1cc0 = (float)local_e00 * 0.00019875691 + 0.0013981999;
        fStack_1cbc = local_e00._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1cb8 = (float)uStack_df8 * 0.00019875691 + 0.0013981999;
        fStack_1cb4 = uStack_df8._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1cb0 = (float)uStack_df0 * 0.00019875691 + 0.0013981999;
        fStack_1cac = uStack_df0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1ca8 = (float)uStack_de8 * 0.00019875691 + 0.0013981999;
        local_e80 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_e78 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_e70 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_e68 = CONCAT44(0x3ad150fb,fStack_1ca8);
        local_ea0 = local_1be0._0_8_;
        uStack_e98 = local_1be0._8_8_;
        uStack_e90 = local_1be0._16_8_;
        uStack_e88 = local_1be0._24_8_;
        local_1cc0 = local_1cc0 * (float)local_e00;
        fStack_1cbc = fStack_1cbc * local_e00._4_4_;
        fStack_1cb8 = fStack_1cb8 * (float)uStack_df8;
        fStack_1cb4 = fStack_1cb4 * uStack_df8._4_4_;
        fStack_1cb0 = fStack_1cb0 * (float)uStack_df0;
        fStack_1cac = fStack_1cac * uStack_df0._4_4_;
        fStack_1ca8 = fStack_1ca8 * (float)uStack_de8;
        local_1a60 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_1a58 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_1a50 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_1a48 = CONCAT44(0x3ad150fb,fStack_1ca8);
        local_1a80 = 0x3c088908;
        uStack_1a7c = 0x3c088908;
        uStack_1a78 = 0x3c088908;
        uStack_1a74 = 0x3c088908;
        uStack_1a70 = 0x3c088908;
        uStack_1a6c = 0x3c088908;
        uStack_1a68 = 0x3c088908;
        uStack_1a64 = 0x3c088908;
        local_1cc0 = local_1cc0 + 0.008333452;
        fStack_1cbc = fStack_1cbc + 0.008333452;
        fStack_1cb8 = fStack_1cb8 + 0.008333452;
        fStack_1cb4 = fStack_1cb4 + 0.008333452;
        fStack_1cb0 = fStack_1cb0 + 0.008333452;
        fStack_1cac = fStack_1cac + 0.008333452;
        fStack_1ca8 = fStack_1ca8 + 0.008333452;
        local_ec0 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_eb8 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_eb0 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_ea8 = CONCAT44(0x3c22b327,fStack_1ca8);
        local_ee0 = local_1be0._0_8_;
        uStack_ed8 = local_1be0._8_8_;
        uStack_ed0 = local_1be0._16_8_;
        uStack_ec8 = local_1be0._24_8_;
        local_1cc0 = local_1cc0 * (float)local_e00;
        fStack_1cbc = fStack_1cbc * local_e00._4_4_;
        fStack_1cb8 = fStack_1cb8 * (float)uStack_df8;
        fStack_1cb4 = fStack_1cb4 * uStack_df8._4_4_;
        fStack_1cb0 = fStack_1cb0 * (float)uStack_df0;
        fStack_1cac = fStack_1cac * uStack_df0._4_4_;
        fStack_1ca8 = fStack_1ca8 * (float)uStack_de8;
        local_1aa0 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_1a98 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_1a90 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_1a88 = CONCAT44(0x3c22b327,fStack_1ca8);
        local_1ac0 = 0x3d2aa9c1;
        uStack_1abc = 0x3d2aa9c1;
        uStack_1ab8 = 0x3d2aa9c1;
        uStack_1ab4 = 0x3d2aa9c1;
        uStack_1ab0 = 0x3d2aa9c1;
        uStack_1aac = 0x3d2aa9c1;
        uStack_1aa8 = 0x3d2aa9c1;
        uStack_1aa4 = 0x3d2aa9c1;
        local_1cc0 = local_1cc0 + 0.041665796;
        fStack_1cbc = fStack_1cbc + 0.041665796;
        fStack_1cb8 = fStack_1cb8 + 0.041665796;
        fStack_1cb4 = fStack_1cb4 + 0.041665796;
        fStack_1cb0 = fStack_1cb0 + 0.041665796;
        fStack_1cac = fStack_1cac + 0.041665796;
        fStack_1ca8 = fStack_1ca8 + 0.041665796;
        local_f00 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_ef8 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_ef0 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_ee8 = CONCAT44(0x3d53568b,fStack_1ca8);
        local_f20 = local_1be0._0_8_;
        uStack_f18 = local_1be0._8_8_;
        uStack_f10 = local_1be0._16_8_;
        uStack_f08 = local_1be0._24_8_;
        local_1cc0 = local_1cc0 * (float)local_e00;
        fStack_1cbc = fStack_1cbc * local_e00._4_4_;
        fStack_1cb8 = fStack_1cb8 * (float)uStack_df8;
        fStack_1cb4 = fStack_1cb4 * uStack_df8._4_4_;
        fStack_1cb0 = fStack_1cb0 * (float)uStack_df0;
        fStack_1cac = fStack_1cac * uStack_df0._4_4_;
        fStack_1ca8 = fStack_1ca8 * (float)uStack_de8;
        local_1ae0 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_1ad8 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_1ad0 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_1ac8 = CONCAT44(0x3d53568b,fStack_1ca8);
        local_1b00 = 0x3e2aaaaa;
        uStack_1afc = 0x3e2aaaaa;
        uStack_1af8 = 0x3e2aaaaa;
        uStack_1af4 = 0x3e2aaaaa;
        uStack_1af0 = 0x3e2aaaaa;
        uStack_1aec = 0x3e2aaaaa;
        uStack_1ae8 = 0x3e2aaaaa;
        uStack_1ae4 = 0x3e2aaaaa;
        local_1cc0 = local_1cc0 + 0.16666666;
        fStack_1cbc = fStack_1cbc + 0.16666666;
        fStack_1cb8 = fStack_1cb8 + 0.16666666;
        fStack_1cb4 = fStack_1cb4 + 0.16666666;
        fStack_1cb0 = fStack_1cb0 + 0.16666666;
        fStack_1cac = fStack_1cac + 0.16666666;
        fStack_1ca8 = fStack_1ca8 + 0.16666666;
        local_f40 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_f38 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_f30 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_f28 = CONCAT44(0x3e5f804d,fStack_1ca8);
        local_f60 = local_1be0._0_8_;
        uStack_f58 = local_1be0._8_8_;
        uStack_f50 = local_1be0._16_8_;
        uStack_f48 = local_1be0._24_8_;
        local_1cc0 = local_1cc0 * (float)local_e00;
        fStack_1cbc = fStack_1cbc * local_e00._4_4_;
        fStack_1cb8 = fStack_1cb8 * (float)uStack_df8;
        fStack_1cb4 = fStack_1cb4 * uStack_df8._4_4_;
        fStack_1cb0 = fStack_1cb0 * (float)uStack_df0;
        fStack_1cac = fStack_1cac * uStack_df0._4_4_;
        fStack_1ca8 = fStack_1ca8 * (float)uStack_de8;
        local_1b20 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_1b18 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_1b10 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_1b08 = CONCAT44(0x3e5f804d,fStack_1ca8);
        local_1b40 = 0x3f000000;
        uStack_1b3c = 0x3f000000;
        uStack_1b38 = 0x3f000000;
        uStack_1b34 = 0x3f000000;
        uStack_1b30 = 0x3f000000;
        uStack_1b2c = 0x3f000000;
        uStack_1b28 = 0x3f000000;
        uStack_1b24 = 0x3f000000;
        local_1cc0 = local_1cc0 + 0.5;
        fStack_1cbc = fStack_1cbc + 0.5;
        fStack_1cb8 = fStack_1cb8 + 0.5;
        fStack_1cb4 = fStack_1cb4 + 0.5;
        fStack_1cb0 = fStack_1cb0 + 0.5;
        fStack_1cac = fStack_1cac + 0.5;
        fStack_1ca8 = fStack_1ca8 + 0.5;
        local_f80 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_f78 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_f70 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_f68 = CONCAT44(0x3f37e013,fStack_1ca8);
        local_fa0 = CONCAT44(fStack_1c9c,local_1ca0);
        uStack_f98 = CONCAT44(fStack_1c94,fStack_1c98);
        uStack_f90 = CONCAT44(fStack_1c8c,fStack_1c90);
        uStack_f88 = CONCAT44(uStack_de8._4_4_,fStack_1c88);
        local_1cc0 = local_1cc0 * local_1ca0;
        fStack_1cbc = fStack_1cbc * fStack_1c9c;
        fStack_1cb8 = fStack_1cb8 * fStack_1c98;
        fStack_1cb4 = fStack_1cb4 * fStack_1c94;
        fStack_1cb0 = fStack_1cb0 * fStack_1c90;
        fStack_1cac = fStack_1cac * fStack_1c8c;
        fStack_1ca8 = fStack_1ca8 * fStack_1c88;
        local_1b60 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_1b58 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_1b50 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_1b48 = CONCAT44(0x3f37e013,fStack_1ca8);
        local_1b80 = local_1be0._0_8_;
        uStack_1b78 = local_1be0._8_8_;
        uStack_1b70 = local_1be0._16_8_;
        uStack_1b68 = local_1be0._24_8_;
        local_1cc0 = local_1cc0 + (float)local_e00;
        fStack_1cbc = fStack_1cbc + local_e00._4_4_;
        fStack_1cb8 = fStack_1cb8 + (float)uStack_df8;
        fStack_1cb4 = fStack_1cb4 + uStack_df8._4_4_;
        fStack_1cb0 = fStack_1cb0 + (float)uStack_df0;
        fStack_1cac = fStack_1cac + uStack_df0._4_4_;
        fStack_1ca8 = fStack_1ca8 + (float)uStack_de8;
        local_1ba0 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_1b98 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_1b90 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_1b88 = CONCAT44(uStack_de8._4_4_ + 0.71826285,fStack_1ca8);
        local_1bc0 = 0x3f8000003f800000;
        uStack_1bb8 = 0x3f8000003f800000;
        uStack_1bb0 = 0x3f8000003f800000;
        uStack_1ba8 = 0x3f8000003f800000;
        local_1cc0 = local_1cc0 + 1.0;
        fStack_1cbc = fStack_1cbc + 1.0;
        fStack_1cb8 = fStack_1cb8 + 1.0;
        fStack_1cb4 = fStack_1cb4 + 1.0;
        fStack_1cb0 = fStack_1cb0 + 1.0;
        fStack_1cac = fStack_1cac + 1.0;
        fStack_1ca8 = fStack_1ca8 + 1.0;
        fStack_1ca4 = uStack_de8._4_4_ + 0.71826285 + 1.0;
        local_c80 = local_1c20;
        uStack_c78 = uStack_1c18;
        uStack_c70 = uStack_1c10;
        uStack_c68 = uStack_1c08;
        local_1c40._4_4_ = (int)local_d80._4_4_;
        local_1c40._0_4_ = (int)(float)local_d80;
        local_1c40._8_4_ = (int)(float)uStack_d78;
        local_1c40._12_4_ = (int)uStack_d78._4_4_;
        local_1c40._16_4_ = (int)(float)uStack_d70;
        local_1c40._20_4_ = (int)uStack_d70._4_4_;
        auVar45 = local_1c40._0_24_;
        local_1c40._24_4_ = (int)(float)uStack_d68;
        local_1c40._28_4_ = (int)uStack_d68._4_4_;
        auVar6 = local_1c40;
        local_c00 = local_1c40._0_8_;
        uStack_bf8 = local_1c40._8_8_;
        local_1c40._16_8_ = auVar45._16_8_;
        uStack_bf0 = local_1c40._16_8_;
        local_1c40._24_8_ = auVar6._24_8_;
        uStack_be8 = local_1c40._24_8_;
        local_c20 = 0x7f0000007f;
        uStack_c18 = 0x7f0000007f;
        uStack_c10 = 0x7f0000007f;
        uStack_c08 = 0x7f0000007f;
        local_b00 = local_1c40._0_8_;
        uStack_af8 = local_1c40._8_8_;
        uStack_af0 = local_1c40._16_8_;
        uStack_ae8 = local_1c40._24_8_;
        local_b20 = 0x7f0000007f;
        uStack_b18 = 0x7f0000007f;
        uStack_b10 = 0x7f0000007f;
        uStack_b08 = 0x7f0000007f;
        auVar22._16_8_ = local_1c40._16_8_;
        auVar22._0_16_ = local_1c40._0_16_;
        auVar22._24_8_ = local_1c40._24_8_;
        auVar21._8_8_ = 0x7f0000007f;
        auVar21._0_8_ = 0x7f0000007f;
        auVar21._16_8_ = 0x7f0000007f;
        auVar21._24_8_ = 0x7f0000007f;
        auVar6 = vpaddd_avx2(auVar22,auVar21);
        local_1c40._0_8_ = auVar6._0_8_;
        local_b80 = local_1c40._0_8_;
        local_1c40._8_8_ = auVar6._8_8_;
        uStack_b78 = local_1c40._8_8_;
        local_1c40._16_8_ = auVar6._16_8_;
        uStack_b70 = local_1c40._16_8_;
        local_1c40._24_8_ = auVar6._24_8_;
        uStack_b68 = local_1c40._24_8_;
        local_b84 = 0x17;
        local_a80 = local_1c40._0_8_;
        uStack_a78 = local_1c40._8_8_;
        uStack_a70 = local_1c40._16_8_;
        uStack_a68 = local_1c40._24_8_;
        local_a84 = 0x17;
        local_1c40 = vpslld_avx2(auVar6,ZEXT416(0x17));
        local_b40 = local_1c40._0_8_;
        uStack_b38 = local_1c40._8_8_;
        uStack_b30 = local_1c40._16_8_;
        uStack_b28 = local_1c40._24_8_;
        local_1ce0 = local_1c40._0_8_;
        uStack_1cd8 = local_1c40._8_8_;
        uStack_1cd0 = local_1c40._16_8_;
        uStack_1cc8 = local_1c40._24_8_;
        local_fc0 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_fb8 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_fb0 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_fa8 = CONCAT44(fStack_1ca4,fStack_1ca8);
        local_fe0._0_4_ = local_1c40._0_4_;
        local_fe0._4_4_ = local_1c40._4_4_;
        uStack_fd8._0_4_ = local_1c40._8_4_;
        uStack_fd8._4_4_ = local_1c40._12_4_;
        uStack_fd0._0_4_ = local_1c40._16_4_;
        uStack_fd0._4_4_ = local_1c40._20_4_;
        uStack_fc8._0_4_ = local_1c40._24_4_;
        local_1cc0 = local_1cc0 * (float)local_fe0;
        fStack_1cbc = fStack_1cbc * local_fe0._4_4_;
        fStack_1cb8 = fStack_1cb8 * (float)uStack_fd8;
        fStack_1cb4 = fStack_1cb4 * uStack_fd8._4_4_;
        fStack_1cb0 = fStack_1cb0 * (float)uStack_fd0;
        fStack_1cac = fStack_1cac * uStack_fd0._4_4_;
        fStack_1ca8 = fStack_1ca8 * (float)uStack_fc8;
        local_1d60 = CONCAT44(fStack_1cbc,local_1cc0);
        uStack_1d58 = CONCAT44(fStack_1cb4,fStack_1cb8);
        uStack_1d50 = CONCAT44(fStack_1cac,fStack_1cb0);
        uStack_1d48 = CONCAT44(fStack_1ca4,fStack_1ca8);
        local_1d40._0_4_ = local_13e0._0_4_;
        local_1d40._4_4_ = local_13e0._4_4_;
        uStack_1d38._0_4_ = local_13e0._8_4_;
        uStack_1d38._4_4_ = local_13e0._12_4_;
        uStack_1d30._0_4_ = auStack_13d0._0_4_;
        uStack_1d30._4_4_ = auStack_13d0._4_4_;
        uStack_1d28._0_4_ = auStack_13d0._8_4_;
        uStack_1d28._4_4_ = auStack_13d0._12_4_;
        local_1de0 = (float)local_1d40 + local_1cc0;
        fStack_1ddc = local_1d40._4_4_ + fStack_1cbc;
        fStack_1dd8 = (float)uStack_1d38 + fStack_1cb8;
        fStack_1dd4 = uStack_1d38._4_4_ + fStack_1cb4;
        fStack_1dd0 = (float)uStack_1d30 + fStack_1cb0;
        fStack_1dcc = uStack_1d30._4_4_ + fStack_1cac;
        fStack_1dc8 = (float)uStack_1d28 + fStack_1ca8;
        fStack_1dc4 = uStack_1d28._4_4_ + fStack_1ca4;
        auVar12._16_8_ = auStack_13d0._0_8_;
        auVar12._0_16_ = local_13e0;
        auVar12._24_8_ = auStack_13d0._8_8_;
        auVar11._4_4_ = fStack_1ddc;
        auVar11._0_4_ = local_1de0;
        auVar11._8_4_ = fStack_1dd8;
        auVar11._12_4_ = fStack_1dd4;
        auVar11._16_4_ = fStack_1dd0;
        auVar11._20_4_ = fStack_1dcc;
        auVar11._24_4_ = fStack_1dc8;
        auVar11._28_4_ = fStack_1dc4;
        local_1f40 = vdivps_avx(auVar12,auVar11);
        *local_1fd0 = local_1f40;
        local_1fd0 = local_1fd0 + 1;
        local_1ea0 = local_2060;
        uStack_1e98 = uStack_2058;
        uStack_1e90 = uStack_2050;
        uStack_1e88 = uStack_2048;
        local_1d40 = local_1dc0;
        uStack_1d38 = uStack_1db8;
        uStack_1d30 = uStack_1db0;
        uStack_1d28 = uStack_1da8;
        _local_1c00 = auVar5;
        local_1520 = local_2060;
        uStack_1518 = uStack_2058;
        uStack_1510 = uStack_2050;
        uStack_1508 = uStack_2048;
        local_1460 = local_1480;
        local_13bc = local_13c0;
        local_13b8 = local_13c0;
        local_13b4 = local_13c0;
        local_13b0 = local_13c0;
        local_13ac = local_13c0;
        local_13a8 = local_13c0;
        local_13a4 = local_13c0;
        local_fe0 = local_1c40._0_8_;
        uStack_fd8 = local_1c40._8_8_;
        uStack_fd0 = local_1c40._16_8_;
        uStack_fc8 = local_1c40._24_8_;
        local_e00 = local_e20;
        uStack_df8 = uStack_e18;
        uStack_df0 = uStack_e10;
        uStack_de8 = uStack_e08;
        local_d80 = local_1c20;
        uStack_d78 = uStack_1c18;
        uStack_d70 = uStack_1c10;
        uStack_d68 = uStack_1c08;
        local_d40 = uVar7;
        uStack_d38 = uVar8;
        uStack_d30 = uVar9;
        uStack_d28 = uVar10;
      }
    }
  }
  else if (local_1fc4 == 4) {
    local_1fc4 = 4;
    for (local_2064 = 0; local_2064 < local_1fbc; local_2064 = local_2064 + 1) {
      this_00 = &local_20b8;
      ncnn::Mat::channel(in_stack_ffffffffffffde70,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffde70 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
      ncnn::Mat::~Mat((Mat *)0x501ff2);
      local_2070 = in_stack_ffffffffffffde70;
      for (local_20bc = 0; local_20bc < local_1fc0; local_20bc = local_20bc + 1) {
        local_1e78 = local_2070;
        local_20d0 = local_2070->data;
        piStack_20c8 = local_2070->refcount;
        auVar42._0_8_ = local_2070->data;
        auVar42._8_8_ = local_2070->refcount;
        local_1e38 = local_2070;
        local_9f4 = 0x3f800000;
        local_a10 = 0x3f800000;
        local_1e10 = 0x3f8000003f800000;
        uStack_1e08 = 0x3f8000003f800000;
        local_9c0._8_8_ = 0x3f8000003f800000;
        local_9c0._0_8_ = 0x3f8000003f800000;
        local_520 = ZEXT816(0) << 0x20;
        local_560 = 0;
        local_510._8_8_ = SUB168(ZEXT816(0),4);
        uStack_558 = local_510._8_8_;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = local_510._8_8_;
        auVar2 = vsubps_avx(auVar43 << 0x40,auVar42);
        local_910 = 0x3f800000;
        uStack_90c = 0x3f800000;
        uStack_908 = 0x3f800000;
        uStack_904 = 0x3f800000;
        local_8d0._0_8_ = auVar2._0_8_;
        local_4c0 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_4b8 = local_8d0._8_8_;
        local_4d0 = 0x42b0c0a5;
        uStack_4cc = 0x42b0c0a5;
        uStack_4c8 = 0x42b0c0a5;
        uStack_4c4 = 0x42b0c0a5;
        auVar29._8_4_ = 0x42b0c0a5;
        auVar29._0_8_ = 0x42b0c0a542b0c0a5;
        auVar29._12_4_ = 0x42b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar29);
        local_8d0._0_8_ = auVar2._0_8_;
        local_480 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_478 = local_8d0._8_8_;
        local_490 = 0xc2b0c0a5;
        uStack_48c = 0xc2b0c0a5;
        uStack_488 = 0xc2b0c0a5;
        uStack_484 = 0xc2b0c0a5;
        auVar31._8_4_ = 0xc2b0c0a5;
        auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar31._12_4_ = 0xc2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar31);
        local_8d0._0_8_ = auVar3._0_8_;
        uVar7 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar3._8_8_;
        uVar8 = local_8d0._8_8_;
        local_1d0 = 0x3fb8aa3b;
        uStack_1cc = 0x3fb8aa3b;
        uStack_1c8 = 0x3fb8aa3b;
        uStack_1c4 = 0x3fb8aa3b;
        local_1c0._0_4_ = auVar3._0_4_;
        local_1c0._4_4_ = auVar3._4_4_;
        uStack_1b8._0_4_ = auVar3._8_4_;
        uStack_1b8._4_4_ = auVar3._12_4_;
        local_8f0._4_4_ = local_1c0._4_4_ * 1.442695;
        local_8f0._0_4_ = (float)local_1c0 * 1.442695;
        uStack_8e8._0_4_ = (float)uStack_1b8 * 1.442695;
        uStack_8e8._4_4_ = uStack_1b8._4_4_ * 1.442695;
        local_7d0 = local_8f0;
        uStack_7c8 = uStack_8e8;
        local_7e0 = 0x3f000000;
        uStack_7dc = 0x3f000000;
        uStack_7d8 = 0x3f000000;
        uStack_7d4 = 0x3f000000;
        local_8f0._0_4_ = (float)local_1c0 * 1.442695 + 0.5;
        local_8f0._4_4_ = local_1c0._4_4_ * 1.442695 + 0.5;
        fVar48 = (float)uStack_1b8 * 1.442695 + 0.5;
        fVar49 = uStack_1b8._4_4_ * 1.442695 + 0.5;
        uStack_8e8._0_4_ = fVar48;
        uStack_8e8._4_4_ = fVar49;
        local_180 = local_8f0;
        uStack_178 = uStack_8e8;
        local_900._4_4_ = (int)(float)local_8f0._4_4_;
        local_900._0_4_ = (int)(float)local_8f0._0_4_;
        local_900._8_4_ = (int)fVar48;
        local_900._12_4_ = (int)fVar49;
        local_160 = local_900._0_8_;
        uStack_158 = local_900._8_8_;
        auVar33._8_8_ = local_900._8_8_;
        auVar33._0_8_ = local_900._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar33);
        local_8e0 = auVar1._0_8_;
        local_120 = local_8e0;
        uStack_8d8 = auVar1._8_8_;
        uStack_118 = uStack_8d8;
        local_130 = local_8f0;
        uStack_128 = uStack_8e8;
        auVar35._8_8_ = uStack_8e8;
        auVar35._0_8_ = local_8f0;
        auVar2 = vcmpps_avx(auVar35,auVar1,1);
        local_920._0_8_ = auVar2._0_8_;
        local_e0 = local_920._0_8_;
        local_920._8_8_ = auVar2._8_8_;
        uStack_d8 = local_920._8_8_;
        local_f0 = 0x3f8000003f800000;
        uStack_e8 = 0x3f8000003f800000;
        auVar37._8_8_ = 0x3f8000003f800000;
        auVar37._0_8_ = 0x3f8000003f800000;
        local_920 = vpand_avx(auVar2,auVar37);
        local_580 = local_8e0;
        uStack_578 = uStack_8d8;
        local_590 = local_920._0_8_;
        uStack_588 = local_920._8_8_;
        _local_8f0 = vsubps_avx(auVar1,local_920);
        local_1f0 = 0x3f318000;
        uStack_1ec = 0x3f318000;
        uStack_1e8 = 0x3f318000;
        uStack_1e4 = 0x3f318000;
        local_1e0._0_4_ = local_8f0._0_4_;
        local_1e0._4_4_ = local_8f0._4_4_;
        uStack_1d8._0_4_ = local_8f0._8_4_;
        uStack_1d8._4_4_ = local_8f0._12_4_;
        local_8e0 = CONCAT44(local_1e0._4_4_ * 0.6933594,(float)local_1e0 * 0.6933594);
        uStack_8d8._0_4_ = (float)uStack_1d8 * 0.6933594;
        uStack_8d8._4_4_ = uStack_1d8._4_4_ * 0.6933594;
        local_200 = local_8f0;
        uStack_1f8 = uStack_8e8;
        local_210 = 0xb95e8083;
        uStack_20c = 0xb95e8083;
        uStack_208 = 0xb95e8083;
        uStack_204 = 0xb95e8083;
        local_5a0 = local_8d0._0_8_;
        uStack_598 = local_8d0._8_8_;
        local_5b0 = local_8e0;
        uStack_5a8 = uStack_8d8;
        auVar28._8_8_ = uStack_8d8;
        auVar28._0_8_ = local_8e0;
        auVar2 = vsubps_avx(auVar3,auVar28);
        local_8d0._0_8_ = auVar2._0_8_;
        local_5c0 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_5b8 = local_8d0._8_8_;
        local_5d0 = CONCAT44(local_1e0._4_4_ * -0.00021219444,(float)local_1e0 * -0.00021219444);
        uStack_5c8 = CONCAT44(uStack_1d8._4_4_ * -0.00021219444,(float)uStack_1d8 * -0.00021219444);
        auVar27._8_8_ = uStack_5c8;
        auVar27._0_8_ = local_5d0;
        local_8d0 = vsubps_avx(auVar2,auVar27);
        local_230 = local_8d0._0_8_;
        uStack_228 = local_8d0._8_8_;
        local_220._0_4_ = local_8d0._0_4_;
        local_220._4_4_ = local_8d0._4_4_;
        uStack_218._0_4_ = local_8d0._8_4_;
        uStack_218._4_4_ = local_8d0._12_4_;
        local_930 = (float)local_220 * (float)local_220;
        fStack_92c = local_220._4_4_ * local_220._4_4_;
        fStack_928 = (float)uStack_218 * (float)uStack_218;
        fStack_924 = uStack_218._4_4_ * uStack_218._4_4_;
        local_240 = 0x3950696739506967;
        uStack_238 = 0x3950696739506967;
        local_250 = local_8d0._0_8_;
        uStack_248 = local_8d0._8_8_;
        local_7f0 = CONCAT44(local_220._4_4_ * 0.00019875691,(float)local_220 * 0.00019875691);
        uStack_7e8 = CONCAT44(uStack_218._4_4_ * 0.00019875691,(float)uStack_218 * 0.00019875691);
        local_800 = 0x3ab743ce;
        uStack_7fc = 0x3ab743ce;
        uStack_7f8 = 0x3ab743ce;
        uStack_7f4 = 0x3ab743ce;
        local_940 = (float)local_220 * 0.00019875691 + 0.0013981999;
        fStack_93c = local_220._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_938 = (float)uStack_218 * 0.00019875691 + 0.0013981999;
        fStack_934 = uStack_218._4_4_ * 0.00019875691 + 0.0013981999;
        local_260 = CONCAT44(fStack_93c,local_940);
        uStack_258 = CONCAT44(fStack_934,fStack_938);
        local_270 = local_8d0._0_8_;
        uStack_268 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_220;
        fStack_93c = fStack_93c * local_220._4_4_;
        fStack_938 = fStack_938 * (float)uStack_218;
        fStack_934 = fStack_934 * uStack_218._4_4_;
        local_810 = CONCAT44(fStack_93c,local_940);
        uStack_808 = CONCAT44(fStack_934,fStack_938);
        local_820 = 0x3c088908;
        uStack_81c = 0x3c088908;
        uStack_818 = 0x3c088908;
        uStack_814 = 0x3c088908;
        local_940 = local_940 + 0.008333452;
        fStack_93c = fStack_93c + 0.008333452;
        fStack_938 = fStack_938 + 0.008333452;
        fStack_934 = fStack_934 + 0.008333452;
        local_280 = CONCAT44(fStack_93c,local_940);
        uStack_278 = CONCAT44(fStack_934,fStack_938);
        local_290 = local_8d0._0_8_;
        uStack_288 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_220;
        fStack_93c = fStack_93c * local_220._4_4_;
        fStack_938 = fStack_938 * (float)uStack_218;
        fStack_934 = fStack_934 * uStack_218._4_4_;
        local_830 = CONCAT44(fStack_93c,local_940);
        uStack_828 = CONCAT44(fStack_934,fStack_938);
        local_840 = 0x3d2aa9c1;
        uStack_83c = 0x3d2aa9c1;
        uStack_838 = 0x3d2aa9c1;
        uStack_834 = 0x3d2aa9c1;
        local_940 = local_940 + 0.041665796;
        fStack_93c = fStack_93c + 0.041665796;
        fStack_938 = fStack_938 + 0.041665796;
        fStack_934 = fStack_934 + 0.041665796;
        local_2a0 = CONCAT44(fStack_93c,local_940);
        uStack_298 = CONCAT44(fStack_934,fStack_938);
        local_2b0 = local_8d0._0_8_;
        uStack_2a8 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_220;
        fStack_93c = fStack_93c * local_220._4_4_;
        fStack_938 = fStack_938 * (float)uStack_218;
        fStack_934 = fStack_934 * uStack_218._4_4_;
        local_850 = CONCAT44(fStack_93c,local_940);
        uStack_848 = CONCAT44(fStack_934,fStack_938);
        local_860 = 0x3e2aaaaa;
        uStack_85c = 0x3e2aaaaa;
        uStack_858 = 0x3e2aaaaa;
        uStack_854 = 0x3e2aaaaa;
        local_940 = local_940 + 0.16666666;
        fStack_93c = fStack_93c + 0.16666666;
        fStack_938 = fStack_938 + 0.16666666;
        fStack_934 = fStack_934 + 0.16666666;
        local_2c0 = CONCAT44(fStack_93c,local_940);
        uStack_2b8 = CONCAT44(fStack_934,fStack_938);
        local_2d0 = local_8d0._0_8_;
        uStack_2c8 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_220;
        fStack_93c = fStack_93c * local_220._4_4_;
        fStack_938 = fStack_938 * (float)uStack_218;
        fStack_934 = fStack_934 * uStack_218._4_4_;
        local_870 = CONCAT44(fStack_93c,local_940);
        uStack_868 = CONCAT44(fStack_934,fStack_938);
        local_880 = 0x3f000000;
        uStack_87c = 0x3f000000;
        uStack_878 = 0x3f000000;
        uStack_874 = 0x3f000000;
        local_940 = local_940 + 0.5;
        fStack_93c = fStack_93c + 0.5;
        fStack_938 = fStack_938 + 0.5;
        fStack_934 = fStack_934 + 0.5;
        local_2e0 = CONCAT44(fStack_93c,local_940);
        uStack_2d8 = CONCAT44(fStack_934,fStack_938);
        local_2f0 = CONCAT44(fStack_92c,local_930);
        uStack_2e8 = CONCAT44(fStack_924,fStack_928);
        local_940 = local_940 * local_930;
        fStack_93c = fStack_93c * fStack_92c;
        fStack_938 = fStack_938 * fStack_928;
        fStack_934 = fStack_934 * fStack_924;
        local_890 = CONCAT44(fStack_93c,local_940);
        uStack_888 = CONCAT44(fStack_934,fStack_938);
        local_8a0 = local_8d0._0_8_;
        uStack_898 = local_8d0._8_8_;
        local_940 = local_940 + (float)local_220;
        fStack_93c = fStack_93c + local_220._4_4_;
        fStack_938 = fStack_938 + (float)uStack_218;
        fStack_934 = fStack_934 + uStack_218._4_4_;
        local_8b0 = CONCAT44(fStack_93c,local_940);
        uStack_8a8 = CONCAT44(fStack_934,fStack_938);
        local_8c0 = 0x3f8000003f800000;
        uStack_8b8 = 0x3f8000003f800000;
        local_940 = local_940 + 1.0;
        fStack_93c = fStack_93c + 1.0;
        fStack_938 = fStack_938 + 1.0;
        fStack_934 = fStack_934 + 1.0;
        local_190 = local_8f0;
        uStack_188 = uStack_8e8;
        local_900._4_4_ = (int)local_1e0._4_4_;
        local_900._0_4_ = (int)(float)local_1e0;
        local_900._8_4_ = (int)(float)uStack_1d8;
        local_900._12_4_ = (int)uStack_1d8._4_4_;
        local_a0 = local_900._0_8_;
        uStack_98 = local_900._8_8_;
        local_b0 = 0x7f0000007f;
        uStack_a8 = 0x7f0000007f;
        auVar41._8_8_ = local_900._8_8_;
        auVar41._0_8_ = local_900._0_8_;
        auVar40._8_8_ = 0x7f0000007f;
        auVar40._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar41,auVar40);
        local_900._0_8_ = auVar2._0_8_;
        local_60 = local_900._0_8_;
        local_900._8_8_ = auVar2._8_8_;
        uStack_58 = local_900._8_8_;
        local_64 = 0x17;
        local_900 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_40 = local_900._0_8_;
        uStack_38 = local_900._8_8_;
        local_950 = local_900._0_8_;
        uStack_948 = local_900._8_8_;
        local_300._4_4_ = fStack_93c;
        local_300._0_4_ = local_940;
        local_300._8_4_ = fStack_938;
        local_300._12_4_ = fStack_934;
        local_310._0_4_ = local_900._0_4_;
        local_310._4_4_ = local_900._4_4_;
        uStack_308._0_4_ = local_900._8_4_;
        uStack_308._4_4_ = local_900._12_4_;
        local_940 = local_940 * (float)local_310;
        fStack_93c = fStack_93c * local_310._4_4_;
        fStack_938 = fStack_938 * (float)uStack_308;
        fStack_934 = fStack_934 * uStack_308._4_4_;
        local_990 = CONCAT44(fStack_93c,local_940);
        uStack_988 = CONCAT44(fStack_934,fStack_938);
        local_9d0 = local_940 + 1.0;
        fStack_9cc = fStack_93c + 1.0;
        fStack_9c8 = fStack_938 + 1.0;
        fStack_9c4 = fStack_934 + 1.0;
        auVar25._4_4_ = fStack_9cc;
        auVar25._0_4_ = local_9d0;
        auVar25._8_4_ = fStack_9c8;
        auVar25._12_4_ = fStack_9c4;
        local_1e50 = vdivps_avx(local_9c0,auVar25);
        local_1e78->data = (void *)local_1e50._0_8_;
        local_1e78->refcount = (int *)local_1e50._8_8_;
        local_2070 = (Mat *)&local_2070->elemsize;
        local_1e00 = local_20d0;
        piStack_1df8 = piStack_20c8;
        uStack_a0c = local_a10;
        uStack_a08 = local_a10;
        uStack_a04 = local_a10;
        local_980 = local_9c0;
        local_570 = local_20d0;
        piStack_568 = piStack_20c8;
        local_510 = local_520;
        local_310 = local_900._0_8_;
        uStack_308 = local_900._8_8_;
        local_220 = local_230;
        uStack_218 = uStack_228;
        local_1e0 = local_8f0;
        uStack_1d8 = uStack_8e8;
        local_1c0 = uVar7;
        uStack_1b8 = uVar8;
      }
    }
  }
  else {
    for (local_20d4 = 0; local_20d4 < local_1fbc; local_20d4 = local_20d4 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffde70,(int)((ulong)in_stack_ffffffffffffde68 >> 0x20));
      pauVar46 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_2128);
      ncnn::Mat::~Mat((Mat *)0x502a42);
      local_20e0 = pauVar46;
      for (local_212c = 0; local_212c + 7 < local_1fc0; local_212c = local_212c + 8) {
        local_1f90 = local_20e0;
        local_1ee0 = *(undefined8 *)*local_20e0;
        uStack_1ed8 = *(undefined8 *)(*local_20e0 + 8);
        uStack_1ed0 = *(undefined8 *)(*local_20e0 + 0x10);
        uStack_1ec8 = *(undefined8 *)(*local_20e0 + 0x18);
        local_1f48 = local_20e0;
        local_1de4 = 0x3f800000;
        local_1400 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_1420 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_1410 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_1f00 = local_1420._0_8_;
        uStack_1ef8 = local_1420._8_8_;
        uStack_1ef0 = auStack_1410._0_8_;
        uStack_1ee8 = auStack_1410._8_8_;
        local_1d80._16_8_ = auStack_1410._0_8_;
        local_1d80._0_16_ = local_1420;
        local_1d80._24_8_ = auStack_1410._8_8_;
        local_14a0 = ZEXT832(0) << 0x20;
        local_14c0 = 0;
        local_1440._8_8_ = SUB328(ZEXT832(0),4);
        uStack_14b8 = local_1440._8_8_;
        uStack_14b0 = 0;
        uStack_14a8 = 0;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_1440._8_8_) << 0x40,*local_20e0);
        local_1940 = 0x3f800000;
        uStack_193c = 0x3f800000;
        uStack_1938 = 0x3f800000;
        uStack_1934 = 0x3f800000;
        uStack_1930 = 0x3f800000;
        uStack_192c = 0x3f800000;
        uStack_1928 = 0x3f800000;
        uStack_1924 = 0x3f800000;
        local_18c0._0_8_ = auVar6._0_8_;
        local_1380 = local_18c0._0_8_;
        local_18c0._8_8_ = auVar6._8_8_;
        uStack_1378 = local_18c0._8_8_;
        local_18c0._16_8_ = auVar6._16_8_;
        uStack_1370 = local_18c0._16_8_;
        local_18c0._24_8_ = auVar6._24_8_;
        uStack_1368 = local_18c0._24_8_;
        local_13a0 = 0x42b0c0a5;
        uStack_139c = 0x42b0c0a5;
        uStack_1398 = 0x42b0c0a5;
        uStack_1394 = 0x42b0c0a5;
        uStack_1390 = 0x42b0c0a5;
        uStack_138c = 0x42b0c0a5;
        uStack_1388 = 0x42b0c0a5;
        uStack_1384 = 0x42b0c0a5;
        auVar15._8_4_ = 0x42b0c0a5;
        auVar15._0_8_ = 0x42b0c0a542b0c0a5;
        auVar15._12_4_ = 0x42b0c0a5;
        auVar15._16_4_ = 0x42b0c0a5;
        auVar15._20_4_ = 0x42b0c0a5;
        auVar15._24_4_ = 0x42b0c0a5;
        auVar15._28_4_ = 0x42b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar15);
        local_18c0._0_8_ = auVar6._0_8_;
        local_1300 = local_18c0._0_8_;
        local_18c0._8_8_ = auVar6._8_8_;
        uStack_12f8 = local_18c0._8_8_;
        local_18c0._16_8_ = auVar6._16_8_;
        uStack_12f0 = local_18c0._16_8_;
        local_18c0._24_8_ = auVar6._24_8_;
        uStack_12e8 = local_18c0._24_8_;
        local_1320 = 0xc2b0c0a5;
        uStack_131c = 0xc2b0c0a5;
        uStack_1318 = 0xc2b0c0a5;
        uStack_1314 = 0xc2b0c0a5;
        uStack_1310 = 0xc2b0c0a5;
        uStack_130c = 0xc2b0c0a5;
        uStack_1308 = 0xc2b0c0a5;
        uStack_1304 = 0xc2b0c0a5;
        auVar17._8_4_ = 0xc2b0c0a5;
        auVar17._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar17._12_4_ = 0xc2b0c0a5;
        auVar17._16_4_ = 0xc2b0c0a5;
        auVar17._20_4_ = 0xc2b0c0a5;
        auVar17._24_4_ = 0xc2b0c0a5;
        auVar17._28_4_ = 0xc2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar17);
        local_18c0._0_8_ = auVar4._0_8_;
        uVar7 = local_18c0._0_8_;
        local_18c0._8_8_ = auVar4._8_8_;
        uVar8 = local_18c0._8_8_;
        local_18c0._16_8_ = auVar4._16_8_;
        uVar9 = local_18c0._16_8_;
        local_18c0._24_8_ = auVar4._24_8_;
        uVar10 = local_18c0._24_8_;
        local_1020 = 0x3fb8aa3b;
        uStack_101c = 0x3fb8aa3b;
        uStack_1018 = 0x3fb8aa3b;
        uStack_1014 = 0x3fb8aa3b;
        uStack_1010 = 0x3fb8aa3b;
        uStack_100c = 0x3fb8aa3b;
        uStack_1008 = 0x3fb8aa3b;
        uStack_1004 = 0x3fb8aa3b;
        local_1000._0_4_ = auVar4._0_4_;
        local_1000._4_4_ = auVar4._4_4_;
        uStack_ff8._0_4_ = auVar4._8_4_;
        uStack_ff8._4_4_ = auVar4._12_4_;
        uStack_ff0._0_4_ = auVar4._16_4_;
        uStack_ff0._4_4_ = auVar4._20_4_;
        uStack_fe8._0_4_ = auVar4._24_4_;
        uStack_fe8._4_4_ = auVar4._28_4_;
        local_1900._4_4_ = local_1000._4_4_ * 1.442695;
        local_1900._0_4_ = (float)local_1000 * 1.442695;
        uStack_18f8._0_4_ = (float)uStack_ff8 * 1.442695;
        uStack_18f8._4_4_ = uStack_ff8._4_4_ * 1.442695;
        uStack_18f0._0_4_ = (float)uStack_ff0 * 1.442695;
        uStack_18f0._4_4_ = uStack_ff0._4_4_ * 1.442695;
        auVar45 = _local_1900;
        uStack_18e8._0_4_ = (float)uStack_fe8 * 1.442695;
        uStack_18e8._4_4_ = uStack_fe8._4_4_;
        auVar6 = _local_1900;
        local_16c0 = local_1900;
        uStack_16b8 = uStack_18f8;
        uStack_18f0 = auVar45._16_8_;
        uStack_16b0 = uStack_18f0;
        uStack_18e8 = auVar6._24_8_;
        uStack_16a8 = uStack_18e8;
        local_16e0 = 0x3f000000;
        uStack_16dc = 0x3f000000;
        uStack_16d8 = 0x3f000000;
        uStack_16d4 = 0x3f000000;
        uStack_16d0 = 0x3f000000;
        uStack_16cc = 0x3f000000;
        uStack_16c8 = 0x3f000000;
        uStack_16c4 = 0x3f000000;
        local_1900._4_4_ = local_1000._4_4_ * 1.442695 + 0.5;
        local_1900._0_4_ = (float)local_1000 * 1.442695 + 0.5;
        uStack_18f8._0_4_ = (float)uStack_ff8 * 1.442695 + 0.5;
        uStack_18f8._4_4_ = uStack_ff8._4_4_ * 1.442695 + 0.5;
        uStack_18f0._0_4_ = (float)uStack_ff0 * 1.442695 + 0.5;
        uStack_18f0._4_4_ = uStack_ff0._4_4_ * 1.442695 + 0.5;
        uStack_18e8._0_4_ = (float)uStack_fe8 * 1.442695 + 0.5;
        uStack_18e8._4_4_ = uStack_fe8._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1900,1);
        auVar6 = vcmpps_avx(_local_1900,auVar5,1);
        local_1960._0_8_ = auVar6._0_8_;
        local_d00 = local_1960._0_8_;
        local_1960._8_8_ = auVar6._8_8_;
        uStack_cf8 = local_1960._8_8_;
        local_1960._16_8_ = auVar6._16_8_;
        uStack_cf0 = local_1960._16_8_;
        local_1960._24_8_ = auVar6._24_8_;
        uStack_ce8 = local_1960._24_8_;
        local_d20 = 0x3f8000003f800000;
        uStack_d18 = 0x3f8000003f800000;
        uStack_d10 = 0x3f8000003f800000;
        uStack_d08 = 0x3f8000003f800000;
        auVar19._8_8_ = 0x3f8000003f800000;
        auVar19._0_8_ = 0x3f8000003f800000;
        auVar19._16_8_ = 0x3f8000003f800000;
        auVar19._24_8_ = 0x3f8000003f800000;
        local_1960 = vpand_avx2(auVar6,auVar19);
        local_18e0 = auVar5._0_8_;
        local_1600 = local_18e0;
        uStack_18d8 = auVar5._8_8_;
        uStack_15f8 = uStack_18d8;
        uStack_18d0 = auVar5._16_8_;
        uStack_15f0 = uStack_18d0;
        uStack_18c8 = auVar5._24_8_;
        uStack_15e8 = uStack_18c8;
        local_1620 = local_1960._0_8_;
        uStack_1618 = local_1960._8_8_;
        uStack_1610 = local_1960._16_8_;
        uStack_1608 = local_1960._24_8_;
        _local_1900 = vsubps_avx(auVar5,local_1960);
        local_1060 = 0x3f318000;
        uStack_105c = 0x3f318000;
        uStack_1058 = 0x3f318000;
        uStack_1054 = 0x3f318000;
        uStack_1050 = 0x3f318000;
        uStack_104c = 0x3f318000;
        uStack_1048 = 0x3f318000;
        uStack_1044 = 0x3f318000;
        local_1040._0_4_ = local_1900._0_4_;
        local_1040._4_4_ = local_1900._4_4_;
        uStack_1038._0_4_ = local_1900._8_4_;
        uStack_1038._4_4_ = local_1900._12_4_;
        uStack_1030._0_4_ = local_1900._16_4_;
        uStack_1030._4_4_ = local_1900._20_4_;
        uStack_1028._0_4_ = local_1900._24_4_;
        uStack_1028._4_4_ = local_1900._28_4_;
        local_18e0._4_4_ = local_1040._4_4_ * 0.6933594;
        local_18e0._0_4_ = (float)local_1040 * 0.6933594;
        uStack_18d8._0_4_ = (float)uStack_1038 * 0.6933594;
        uStack_18d8._4_4_ = uStack_1038._4_4_ * 0.6933594;
        uStack_18d0._0_4_ = (float)uStack_1030 * 0.6933594;
        uStack_18d0._4_4_ = uStack_1030._4_4_ * 0.6933594;
        auVar45 = _local_18e0;
        uStack_18c8._0_4_ = (float)uStack_1028 * 0.6933594;
        uStack_18c8._4_4_ = uStack_1028._4_4_;
        auVar15 = _local_18e0;
        local_1080 = local_1900;
        uStack_1078 = uStack_18f8;
        uStack_1070 = uStack_18f0;
        uStack_1068 = uStack_18e8;
        local_10a0 = 0xb95e8083;
        uStack_109c = 0xb95e8083;
        uStack_1098 = 0xb95e8083;
        uStack_1094 = 0xb95e8083;
        uStack_1090 = 0xb95e8083;
        uStack_108c = 0xb95e8083;
        uStack_1088 = 0xb95e8083;
        uStack_1084 = 0xb95e8083;
        local_1640 = local_18c0._0_8_;
        uStack_1638 = local_18c0._8_8_;
        uStack_1630 = local_18c0._16_8_;
        uStack_1628 = local_18c0._24_8_;
        local_1660 = local_18e0;
        uStack_1658 = uStack_18d8;
        uStack_18d0 = auVar45._16_8_;
        uStack_1650 = uStack_18d0;
        uStack_18c8 = auVar15._24_8_;
        uStack_1648 = uStack_18c8;
        auVar5._16_8_ = uStack_18d0;
        auVar5._0_16_ = _local_18e0;
        auVar5._24_8_ = uStack_18c8;
        auVar6 = vsubps_avx(auVar4,auVar5);
        local_18c0._0_8_ = auVar6._0_8_;
        local_1680 = local_18c0._0_8_;
        local_18c0._8_8_ = auVar6._8_8_;
        uStack_1678 = local_18c0._8_8_;
        local_18c0._16_8_ = auVar6._16_8_;
        uStack_1670 = local_18c0._16_8_;
        local_18c0._24_8_ = auVar6._24_8_;
        uStack_1668 = local_18c0._24_8_;
        local_16a0 = CONCAT44(local_1040._4_4_ * -0.00021219444,(float)local_1040 * -0.00021219444);
        uStack_1698 = CONCAT44(uStack_1038._4_4_ * -0.00021219444,
                               (float)uStack_1038 * -0.00021219444);
        uStack_1690 = CONCAT44(uStack_1030._4_4_ * -0.00021219444,
                               (float)uStack_1030 * -0.00021219444);
        uStack_1688 = CONCAT44(uStack_1028._4_4_,(float)uStack_1028 * -0.00021219444);
        auVar4._8_8_ = uStack_1698;
        auVar4._0_8_ = local_16a0;
        auVar4._16_8_ = uStack_1690;
        auVar4._24_8_ = uStack_1688;
        local_18c0 = vsubps_avx(auVar6,auVar4);
        local_10e0 = local_18c0._0_8_;
        uStack_10d8 = local_18c0._8_8_;
        uStack_10d0 = local_18c0._16_8_;
        uStack_10c8 = local_18c0._24_8_;
        local_10c0._0_4_ = local_18c0._0_4_;
        local_10c0._4_4_ = local_18c0._4_4_;
        uStack_10b8._0_4_ = local_18c0._8_4_;
        uStack_10b8._4_4_ = local_18c0._12_4_;
        uStack_10b0._0_4_ = local_18c0._16_4_;
        uStack_10b0._4_4_ = local_18c0._20_4_;
        uStack_10a8._0_4_ = local_18c0._24_4_;
        uStack_10a8._4_4_ = local_18c0._28_4_;
        fStack_1964 = uStack_10a8._4_4_;
        local_1980 = (float)local_10c0 * (float)local_10c0;
        fStack_197c = local_10c0._4_4_ * local_10c0._4_4_;
        fStack_1978 = (float)uStack_10b8 * (float)uStack_10b8;
        fStack_1974 = uStack_10b8._4_4_ * uStack_10b8._4_4_;
        fStack_1970 = (float)uStack_10b0 * (float)uStack_10b0;
        fStack_196c = uStack_10b0._4_4_ * uStack_10b0._4_4_;
        fStack_1968 = (float)uStack_10a8 * (float)uStack_10a8;
        local_1100 = 0x3950696739506967;
        uStack_10f8 = 0x3950696739506967;
        uStack_10f0 = 0x3950696739506967;
        uStack_10e8 = 0x3950696739506967;
        local_1120 = local_18c0._0_8_;
        uStack_1118 = local_18c0._8_8_;
        uStack_1110 = local_18c0._16_8_;
        uStack_1108 = local_18c0._24_8_;
        local_1700 = CONCAT44(local_10c0._4_4_ * 0.00019875691,(float)local_10c0 * 0.00019875691);
        uStack_16f8 = CONCAT44(uStack_10b8._4_4_ * 0.00019875691,(float)uStack_10b8 * 0.00019875691)
        ;
        uStack_16f0 = CONCAT44(uStack_10b0._4_4_ * 0.00019875691,(float)uStack_10b0 * 0.00019875691)
        ;
        uStack_16e8 = CONCAT44(0x39506967,(float)uStack_10a8 * 0.00019875691);
        local_1720 = 0x3ab743ce;
        uStack_171c = 0x3ab743ce;
        uStack_1718 = 0x3ab743ce;
        uStack_1714 = 0x3ab743ce;
        uStack_1710 = 0x3ab743ce;
        uStack_170c = 0x3ab743ce;
        uStack_1708 = 0x3ab743ce;
        uStack_1704 = 0x3ab743ce;
        local_19a0 = (float)local_10c0 * 0.00019875691 + 0.0013981999;
        fStack_199c = local_10c0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1998 = (float)uStack_10b8 * 0.00019875691 + 0.0013981999;
        fStack_1994 = uStack_10b8._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1990 = (float)uStack_10b0 * 0.00019875691 + 0.0013981999;
        fStack_198c = uStack_10b0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1988 = (float)uStack_10a8 * 0.00019875691 + 0.0013981999;
        local_1140 = CONCAT44(fStack_199c,local_19a0);
        uStack_1138 = CONCAT44(fStack_1994,fStack_1998);
        uStack_1130 = CONCAT44(fStack_198c,fStack_1990);
        uStack_1128 = CONCAT44(0x3ad150fb,fStack_1988);
        local_1160 = local_18c0._0_8_;
        uStack_1158 = local_18c0._8_8_;
        uStack_1150 = local_18c0._16_8_;
        uStack_1148 = local_18c0._24_8_;
        local_19a0 = local_19a0 * (float)local_10c0;
        fStack_199c = fStack_199c * local_10c0._4_4_;
        fStack_1998 = fStack_1998 * (float)uStack_10b8;
        fStack_1994 = fStack_1994 * uStack_10b8._4_4_;
        fStack_1990 = fStack_1990 * (float)uStack_10b0;
        fStack_198c = fStack_198c * uStack_10b0._4_4_;
        fStack_1988 = fStack_1988 * (float)uStack_10a8;
        local_1740 = CONCAT44(fStack_199c,local_19a0);
        uStack_1738 = CONCAT44(fStack_1994,fStack_1998);
        uStack_1730 = CONCAT44(fStack_198c,fStack_1990);
        uStack_1728 = CONCAT44(0x3ad150fb,fStack_1988);
        local_1760 = 0x3c088908;
        uStack_175c = 0x3c088908;
        uStack_1758 = 0x3c088908;
        uStack_1754 = 0x3c088908;
        uStack_1750 = 0x3c088908;
        uStack_174c = 0x3c088908;
        uStack_1748 = 0x3c088908;
        uStack_1744 = 0x3c088908;
        local_19a0 = local_19a0 + 0.008333452;
        fStack_199c = fStack_199c + 0.008333452;
        fStack_1998 = fStack_1998 + 0.008333452;
        fStack_1994 = fStack_1994 + 0.008333452;
        fStack_1990 = fStack_1990 + 0.008333452;
        fStack_198c = fStack_198c + 0.008333452;
        fStack_1988 = fStack_1988 + 0.008333452;
        local_1180 = CONCAT44(fStack_199c,local_19a0);
        uStack_1178 = CONCAT44(fStack_1994,fStack_1998);
        uStack_1170 = CONCAT44(fStack_198c,fStack_1990);
        uStack_1168 = CONCAT44(0x3c22b327,fStack_1988);
        local_11a0 = local_18c0._0_8_;
        uStack_1198 = local_18c0._8_8_;
        uStack_1190 = local_18c0._16_8_;
        uStack_1188 = local_18c0._24_8_;
        local_19a0 = local_19a0 * (float)local_10c0;
        fStack_199c = fStack_199c * local_10c0._4_4_;
        fStack_1998 = fStack_1998 * (float)uStack_10b8;
        fStack_1994 = fStack_1994 * uStack_10b8._4_4_;
        fStack_1990 = fStack_1990 * (float)uStack_10b0;
        fStack_198c = fStack_198c * uStack_10b0._4_4_;
        fStack_1988 = fStack_1988 * (float)uStack_10a8;
        local_1780 = CONCAT44(fStack_199c,local_19a0);
        uStack_1778 = CONCAT44(fStack_1994,fStack_1998);
        uStack_1770 = CONCAT44(fStack_198c,fStack_1990);
        uStack_1768 = CONCAT44(0x3c22b327,fStack_1988);
        local_17a0 = 0x3d2aa9c1;
        uStack_179c = 0x3d2aa9c1;
        uStack_1798 = 0x3d2aa9c1;
        uStack_1794 = 0x3d2aa9c1;
        uStack_1790 = 0x3d2aa9c1;
        uStack_178c = 0x3d2aa9c1;
        uStack_1788 = 0x3d2aa9c1;
        uStack_1784 = 0x3d2aa9c1;
        local_19a0 = local_19a0 + 0.041665796;
        fStack_199c = fStack_199c + 0.041665796;
        fStack_1998 = fStack_1998 + 0.041665796;
        fStack_1994 = fStack_1994 + 0.041665796;
        fStack_1990 = fStack_1990 + 0.041665796;
        fStack_198c = fStack_198c + 0.041665796;
        fStack_1988 = fStack_1988 + 0.041665796;
        local_11c0 = CONCAT44(fStack_199c,local_19a0);
        uStack_11b8 = CONCAT44(fStack_1994,fStack_1998);
        uStack_11b0 = CONCAT44(fStack_198c,fStack_1990);
        uStack_11a8 = CONCAT44(0x3d53568b,fStack_1988);
        local_11e0 = local_18c0._0_8_;
        uStack_11d8 = local_18c0._8_8_;
        uStack_11d0 = local_18c0._16_8_;
        uStack_11c8 = local_18c0._24_8_;
        local_19a0 = local_19a0 * (float)local_10c0;
        fStack_199c = fStack_199c * local_10c0._4_4_;
        fStack_1998 = fStack_1998 * (float)uStack_10b8;
        fStack_1994 = fStack_1994 * uStack_10b8._4_4_;
        fStack_1990 = fStack_1990 * (float)uStack_10b0;
        fStack_198c = fStack_198c * uStack_10b0._4_4_;
        fStack_1988 = fStack_1988 * (float)uStack_10a8;
        local_17c0 = CONCAT44(fStack_199c,local_19a0);
        uStack_17b8 = CONCAT44(fStack_1994,fStack_1998);
        uStack_17b0 = CONCAT44(fStack_198c,fStack_1990);
        uStack_17a8 = CONCAT44(0x3d53568b,fStack_1988);
        local_17e0 = 0x3e2aaaaa;
        uStack_17dc = 0x3e2aaaaa;
        uStack_17d8 = 0x3e2aaaaa;
        uStack_17d4 = 0x3e2aaaaa;
        uStack_17d0 = 0x3e2aaaaa;
        uStack_17cc = 0x3e2aaaaa;
        uStack_17c8 = 0x3e2aaaaa;
        uStack_17c4 = 0x3e2aaaaa;
        local_19a0 = local_19a0 + 0.16666666;
        fStack_199c = fStack_199c + 0.16666666;
        fStack_1998 = fStack_1998 + 0.16666666;
        fStack_1994 = fStack_1994 + 0.16666666;
        fStack_1990 = fStack_1990 + 0.16666666;
        fStack_198c = fStack_198c + 0.16666666;
        fStack_1988 = fStack_1988 + 0.16666666;
        local_1200 = CONCAT44(fStack_199c,local_19a0);
        uStack_11f8 = CONCAT44(fStack_1994,fStack_1998);
        uStack_11f0 = CONCAT44(fStack_198c,fStack_1990);
        uStack_11e8 = CONCAT44(0x3e5f804d,fStack_1988);
        local_1220 = local_18c0._0_8_;
        uStack_1218 = local_18c0._8_8_;
        uStack_1210 = local_18c0._16_8_;
        uStack_1208 = local_18c0._24_8_;
        local_19a0 = local_19a0 * (float)local_10c0;
        fStack_199c = fStack_199c * local_10c0._4_4_;
        fStack_1998 = fStack_1998 * (float)uStack_10b8;
        fStack_1994 = fStack_1994 * uStack_10b8._4_4_;
        fStack_1990 = fStack_1990 * (float)uStack_10b0;
        fStack_198c = fStack_198c * uStack_10b0._4_4_;
        fStack_1988 = fStack_1988 * (float)uStack_10a8;
        local_1800 = CONCAT44(fStack_199c,local_19a0);
        uStack_17f8 = CONCAT44(fStack_1994,fStack_1998);
        uStack_17f0 = CONCAT44(fStack_198c,fStack_1990);
        uStack_17e8 = CONCAT44(0x3e5f804d,fStack_1988);
        local_1820 = 0x3f000000;
        uStack_181c = 0x3f000000;
        uStack_1818 = 0x3f000000;
        uStack_1814 = 0x3f000000;
        uStack_1810 = 0x3f000000;
        uStack_180c = 0x3f000000;
        uStack_1808 = 0x3f000000;
        uStack_1804 = 0x3f000000;
        local_19a0 = local_19a0 + 0.5;
        fStack_199c = fStack_199c + 0.5;
        fStack_1998 = fStack_1998 + 0.5;
        fStack_1994 = fStack_1994 + 0.5;
        fStack_1990 = fStack_1990 + 0.5;
        fStack_198c = fStack_198c + 0.5;
        fStack_1988 = fStack_1988 + 0.5;
        local_1240 = CONCAT44(fStack_199c,local_19a0);
        uStack_1238 = CONCAT44(fStack_1994,fStack_1998);
        uStack_1230 = CONCAT44(fStack_198c,fStack_1990);
        uStack_1228 = CONCAT44(0x3f37e013,fStack_1988);
        local_1260 = CONCAT44(fStack_197c,local_1980);
        uStack_1258 = CONCAT44(fStack_1974,fStack_1978);
        uStack_1250 = CONCAT44(fStack_196c,fStack_1970);
        uStack_1248 = CONCAT44(uStack_10a8._4_4_,fStack_1968);
        local_19a0 = local_19a0 * local_1980;
        fStack_199c = fStack_199c * fStack_197c;
        fStack_1998 = fStack_1998 * fStack_1978;
        fStack_1994 = fStack_1994 * fStack_1974;
        fStack_1990 = fStack_1990 * fStack_1970;
        fStack_198c = fStack_198c * fStack_196c;
        fStack_1988 = fStack_1988 * fStack_1968;
        local_1840 = CONCAT44(fStack_199c,local_19a0);
        uStack_1838 = CONCAT44(fStack_1994,fStack_1998);
        uStack_1830 = CONCAT44(fStack_198c,fStack_1990);
        uStack_1828 = CONCAT44(0x3f37e013,fStack_1988);
        local_1860 = local_18c0._0_8_;
        uStack_1858 = local_18c0._8_8_;
        uStack_1850 = local_18c0._16_8_;
        uStack_1848 = local_18c0._24_8_;
        local_19a0 = local_19a0 + (float)local_10c0;
        fStack_199c = fStack_199c + local_10c0._4_4_;
        fStack_1998 = fStack_1998 + (float)uStack_10b8;
        fStack_1994 = fStack_1994 + uStack_10b8._4_4_;
        fStack_1990 = fStack_1990 + (float)uStack_10b0;
        fStack_198c = fStack_198c + uStack_10b0._4_4_;
        fStack_1988 = fStack_1988 + (float)uStack_10a8;
        local_1880 = CONCAT44(fStack_199c,local_19a0);
        uStack_1878 = CONCAT44(fStack_1994,fStack_1998);
        uStack_1870 = CONCAT44(fStack_198c,fStack_1990);
        uStack_1868 = CONCAT44(uStack_10a8._4_4_ + 0.71826285,fStack_1988);
        local_18a0 = 0x3f8000003f800000;
        uStack_1898 = 0x3f8000003f800000;
        uStack_1890 = 0x3f8000003f800000;
        uStack_1888 = 0x3f8000003f800000;
        local_19a0 = local_19a0 + 1.0;
        fStack_199c = fStack_199c + 1.0;
        fStack_1998 = fStack_1998 + 1.0;
        fStack_1994 = fStack_1994 + 1.0;
        fStack_1990 = fStack_1990 + 1.0;
        fStack_198c = fStack_198c + 1.0;
        fStack_1988 = fStack_1988 + 1.0;
        fStack_1984 = uStack_10a8._4_4_ + 0.71826285 + 1.0;
        local_ca0 = local_1900;
        uStack_c98 = uStack_18f8;
        uStack_c90 = uStack_18f0;
        uStack_c88 = uStack_18e8;
        local_1920._4_4_ = (int)local_1040._4_4_;
        local_1920._0_4_ = (int)(float)local_1040;
        local_1920._8_4_ = (int)(float)uStack_1038;
        local_1920._12_4_ = (int)uStack_1038._4_4_;
        local_1920._16_4_ = (int)(float)uStack_1030;
        local_1920._20_4_ = (int)uStack_1030._4_4_;
        auVar45 = local_1920._0_24_;
        local_1920._24_4_ = (int)(float)uStack_1028;
        local_1920._28_4_ = (int)uStack_1028._4_4_;
        auVar6 = local_1920;
        local_c40 = local_1920._0_8_;
        uStack_c38 = local_1920._8_8_;
        local_1920._16_8_ = auVar45._16_8_;
        uStack_c30 = local_1920._16_8_;
        local_1920._24_8_ = auVar6._24_8_;
        uStack_c28 = local_1920._24_8_;
        local_c60 = 0x7f0000007f;
        uStack_c58 = 0x7f0000007f;
        uStack_c50 = 0x7f0000007f;
        uStack_c48 = 0x7f0000007f;
        local_ac0 = local_1920._0_8_;
        uStack_ab8 = local_1920._8_8_;
        uStack_ab0 = local_1920._16_8_;
        uStack_aa8 = local_1920._24_8_;
        local_ae0 = 0x7f0000007f;
        uStack_ad8 = 0x7f0000007f;
        uStack_ad0 = 0x7f0000007f;
        uStack_ac8 = 0x7f0000007f;
        auVar24._16_8_ = local_1920._16_8_;
        auVar24._0_16_ = local_1920._0_16_;
        auVar24._24_8_ = local_1920._24_8_;
        auVar23._8_8_ = 0x7f0000007f;
        auVar23._0_8_ = 0x7f0000007f;
        auVar23._16_8_ = 0x7f0000007f;
        auVar23._24_8_ = 0x7f0000007f;
        auVar6 = vpaddd_avx2(auVar24,auVar23);
        local_1920._0_8_ = auVar6._0_8_;
        local_bc0 = local_1920._0_8_;
        local_1920._8_8_ = auVar6._8_8_;
        uStack_bb8 = local_1920._8_8_;
        local_1920._16_8_ = auVar6._16_8_;
        uStack_bb0 = local_1920._16_8_;
        local_1920._24_8_ = auVar6._24_8_;
        uStack_ba8 = local_1920._24_8_;
        local_bc4 = 0x17;
        local_a40 = local_1920._0_8_;
        uStack_a38 = local_1920._8_8_;
        uStack_a30 = local_1920._16_8_;
        uStack_a28 = local_1920._24_8_;
        local_a44 = 0x17;
        local_1920 = vpslld_avx2(auVar6,ZEXT416(0x17));
        local_b60 = local_1920._0_8_;
        uStack_b58 = local_1920._8_8_;
        uStack_b50 = local_1920._16_8_;
        uStack_b48 = local_1920._24_8_;
        local_19c0 = local_1920._0_8_;
        uStack_19b8 = local_1920._8_8_;
        uStack_19b0 = local_1920._16_8_;
        uStack_19a8 = local_1920._24_8_;
        local_1280._4_4_ = fStack_199c;
        local_1280._0_4_ = local_19a0;
        local_1280._8_4_ = fStack_1998;
        local_1280._12_4_ = fStack_1994;
        local_1280._16_4_ = fStack_1990;
        local_1280._20_4_ = fStack_198c;
        local_1280._24_4_ = fStack_1988;
        local_1280._28_4_ = fStack_1984;
        local_12a0._0_4_ = local_1920._0_4_;
        local_12a0._4_4_ = local_1920._4_4_;
        uStack_1298._0_4_ = local_1920._8_4_;
        uStack_1298._4_4_ = local_1920._12_4_;
        uStack_1290._0_4_ = local_1920._16_4_;
        uStack_1290._4_4_ = local_1920._20_4_;
        uStack_1288._0_4_ = local_1920._24_4_;
        local_19a0 = local_19a0 * (float)local_12a0;
        fStack_199c = fStack_199c * local_12a0._4_4_;
        fStack_1998 = fStack_1998 * (float)uStack_1298;
        fStack_1994 = fStack_1994 * uStack_1298._4_4_;
        fStack_1990 = fStack_1990 * (float)uStack_1290;
        fStack_198c = fStack_198c * uStack_1290._4_4_;
        fStack_1988 = fStack_1988 * (float)uStack_1288;
        local_1d20 = CONCAT44(fStack_199c,local_19a0);
        uStack_1d18 = CONCAT44(fStack_1994,fStack_1998);
        uStack_1d10 = CONCAT44(fStack_198c,fStack_1990);
        uStack_1d08 = CONCAT44(fStack_1984,fStack_1988);
        local_1d00._0_4_ = local_1420._0_4_;
        local_1d00._4_4_ = local_1420._4_4_;
        fStack_1cf8 = local_1420._8_4_;
        fStack_1cf4 = local_1420._12_4_;
        fStack_1cf0 = auStack_1410._0_4_;
        fStack_1cec = auStack_1410._4_4_;
        fStack_1ce8 = auStack_1410._8_4_;
        fStack_1ce4 = auStack_1410._12_4_;
        local_1da0 = (float)local_1d00._0_4_ + local_19a0;
        fStack_1d9c = (float)local_1d00._4_4_ + fStack_199c;
        fStack_1d98 = fStack_1cf8 + fStack_1998;
        fStack_1d94 = fStack_1cf4 + fStack_1994;
        fStack_1d90 = fStack_1cf0 + fStack_1990;
        fStack_1d8c = fStack_1cec + fStack_198c;
        fStack_1d88 = fStack_1ce8 + fStack_1988;
        fStack_1d84 = fStack_1ce4 + fStack_1984;
        auVar6._4_4_ = fStack_1d9c;
        auVar6._0_4_ = local_1da0;
        auVar6._8_4_ = fStack_1d98;
        auVar6._12_4_ = fStack_1d94;
        auVar6._16_4_ = fStack_1d90;
        auVar6._20_4_ = fStack_1d8c;
        auVar6._24_4_ = fStack_1d88;
        auVar6._28_4_ = fStack_1d84;
        local_1f80 = vdivps_avx(local_1d80,auVar6);
        *local_20e0 = local_1f80;
        local_20e0 = local_20e0 + 1;
        _local_1d00 = local_1d80;
        _local_18e0 = auVar15;
        local_14e0 = local_1ee0;
        uStack_14d8 = uStack_1ed8;
        uStack_14d0 = uStack_1ed0;
        uStack_14c8 = uStack_1ec8;
        local_1440 = local_14a0;
        local_13fc = local_1400;
        local_13f8 = local_1400;
        local_13f4 = local_1400;
        local_13f0 = local_1400;
        local_13ec = local_1400;
        local_13e8 = local_1400;
        local_13e4 = local_1400;
        local_12a0 = local_1920._0_8_;
        uStack_1298 = local_1920._8_8_;
        uStack_1290 = local_1920._16_8_;
        uStack_1288 = local_1920._24_8_;
        local_10c0 = local_10e0;
        uStack_10b8 = uStack_10d8;
        uStack_10b0 = uStack_10d0;
        uStack_10a8 = uStack_10c8;
        local_1040 = local_1900;
        uStack_1038 = uStack_18f8;
        uStack_1030 = uStack_18f0;
        uStack_1028 = uStack_18e8;
        local_1000 = uVar7;
        uStack_ff8 = uVar8;
        uStack_ff0 = uVar9;
        uStack_fe8 = uVar10;
      }
      for (; local_212c + 3 < local_1fc0; local_212c = local_212c + 4) {
        local_1e80 = local_20e0;
        local_1e20 = *(undefined8 *)*local_20e0;
        uStack_1e18 = *(undefined8 *)(*local_20e0 + 8);
        local_1e58 = local_20e0;
        local_9d4 = 0x3f800000;
        local_9f0 = 0x3f800000;
        local_1e30 = 0x3f8000003f800000;
        uStack_1e28 = 0x3f8000003f800000;
        local_9a0._8_8_ = 0x3f8000003f800000;
        local_9a0._0_8_ = 0x3f8000003f800000;
        local_530 = ZEXT816(0) << 0x20;
        local_540 = 0;
        local_500._8_8_ = SUB168(ZEXT816(0),4);
        uStack_538 = local_500._8_8_;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = local_500._8_8_;
        auVar2 = vsubps_avx(auVar44 << 0x40,*(undefined1 (*) [16])*local_20e0);
        local_780 = 0x3f800000;
        uStack_77c = 0x3f800000;
        uStack_778 = 0x3f800000;
        uStack_774 = 0x3f800000;
        local_740._0_8_ = auVar2._0_8_;
        local_4e0 = local_740._0_8_;
        local_740._8_8_ = auVar2._8_8_;
        uStack_4d8 = local_740._8_8_;
        local_4f0 = 0x42b0c0a5;
        uStack_4ec = 0x42b0c0a5;
        uStack_4e8 = 0x42b0c0a5;
        uStack_4e4 = 0x42b0c0a5;
        auVar3._8_4_ = 0x42b0c0a5;
        auVar3._0_8_ = 0x42b0c0a542b0c0a5;
        auVar3._12_4_ = 0x42b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar3);
        local_740._0_8_ = auVar2._0_8_;
        local_4a0 = local_740._0_8_;
        local_740._8_8_ = auVar2._8_8_;
        uStack_498 = local_740._8_8_;
        local_4b0 = 0xc2b0c0a5;
        uStack_4ac = 0xc2b0c0a5;
        uStack_4a8 = 0xc2b0c0a5;
        uStack_4a4 = 0xc2b0c0a5;
        auVar30._8_4_ = 0xc2b0c0a5;
        auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar30._12_4_ = 0xc2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar30);
        local_740._0_8_ = auVar3._0_8_;
        uVar7 = local_740._0_8_;
        local_740._8_8_ = auVar3._8_8_;
        uVar8 = local_740._8_8_;
        local_330 = 0x3fb8aa3b;
        uStack_32c = 0x3fb8aa3b;
        uStack_328 = 0x3fb8aa3b;
        uStack_324 = 0x3fb8aa3b;
        local_320._0_4_ = auVar3._0_4_;
        local_320._4_4_ = auVar3._4_4_;
        uStack_318._0_4_ = auVar3._8_4_;
        uStack_318._4_4_ = auVar3._12_4_;
        local_760._4_4_ = local_320._4_4_ * 1.442695;
        local_760._0_4_ = (float)local_320 * 1.442695;
        uStack_758._0_4_ = (float)uStack_318 * 1.442695;
        uStack_758._4_4_ = uStack_318._4_4_ * 1.442695;
        local_640 = local_760;
        uStack_638 = uStack_758;
        local_650 = 0x3f000000;
        uStack_64c = 0x3f000000;
        uStack_648 = 0x3f000000;
        uStack_644 = 0x3f000000;
        local_760._0_4_ = (float)local_320 * 1.442695 + 0.5;
        local_760._4_4_ = local_320._4_4_ * 1.442695 + 0.5;
        fVar48 = (float)uStack_318 * 1.442695 + 0.5;
        fVar49 = uStack_318._4_4_ * 1.442695 + 0.5;
        uStack_758._0_4_ = fVar48;
        uStack_758._4_4_ = fVar49;
        local_1a0 = local_760;
        uStack_198 = uStack_758;
        local_770._4_4_ = (int)(float)local_760._4_4_;
        local_770._0_4_ = (int)(float)local_760._0_4_;
        local_770._8_4_ = (int)fVar48;
        local_770._12_4_ = (int)fVar49;
        local_170 = local_770._0_8_;
        uStack_168 = local_770._8_8_;
        auVar32._8_8_ = local_770._8_8_;
        auVar32._0_8_ = local_770._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar32);
        local_750 = auVar1._0_8_;
        local_140 = local_750;
        uStack_748 = auVar1._8_8_;
        uStack_138 = uStack_748;
        local_150 = local_760;
        uStack_148 = uStack_758;
        auVar34._8_8_ = uStack_758;
        auVar34._0_8_ = local_760;
        auVar2 = vcmpps_avx(auVar34,auVar1,1);
        local_790._0_8_ = auVar2._0_8_;
        local_100 = local_790._0_8_;
        local_790._8_8_ = auVar2._8_8_;
        uStack_f8 = local_790._8_8_;
        local_110 = 0x3f8000003f800000;
        uStack_108 = 0x3f8000003f800000;
        auVar36._8_8_ = 0x3f8000003f800000;
        auVar36._0_8_ = 0x3f8000003f800000;
        local_790 = vpand_avx(auVar2,auVar36);
        local_5e0 = local_750;
        uStack_5d8 = uStack_748;
        local_5f0 = local_790._0_8_;
        uStack_5e8 = local_790._8_8_;
        _local_760 = vsubps_avx(auVar1,local_790);
        local_350 = 0x3f318000;
        uStack_34c = 0x3f318000;
        uStack_348 = 0x3f318000;
        uStack_344 = 0x3f318000;
        local_340._0_4_ = local_760._0_4_;
        local_340._4_4_ = local_760._4_4_;
        uStack_338._0_4_ = local_760._8_4_;
        uStack_338._4_4_ = local_760._12_4_;
        local_750 = CONCAT44(local_340._4_4_ * 0.6933594,(float)local_340 * 0.6933594);
        uStack_748._0_4_ = (float)uStack_338 * 0.6933594;
        uStack_748._4_4_ = uStack_338._4_4_ * 0.6933594;
        local_360 = local_760;
        uStack_358 = uStack_758;
        local_370 = 0xb95e8083;
        uStack_36c = 0xb95e8083;
        uStack_368 = 0xb95e8083;
        uStack_364 = 0xb95e8083;
        local_600 = local_740._0_8_;
        uStack_5f8 = local_740._8_8_;
        local_610 = local_750;
        uStack_608 = uStack_748;
        auVar26._8_8_ = uStack_748;
        auVar26._0_8_ = local_750;
        auVar2 = vsubps_avx(auVar3,auVar26);
        local_740._0_8_ = auVar2._0_8_;
        local_620 = local_740._0_8_;
        local_740._8_8_ = auVar2._8_8_;
        uStack_618 = local_740._8_8_;
        local_630 = CONCAT44(local_340._4_4_ * -0.00021219444,(float)local_340 * -0.00021219444);
        uStack_628 = CONCAT44(uStack_338._4_4_ * -0.00021219444,(float)uStack_338 * -0.00021219444);
        auVar1._8_8_ = uStack_628;
        auVar1._0_8_ = local_630;
        local_740 = vsubps_avx(auVar2,auVar1);
        local_390 = local_740._0_8_;
        uStack_388 = local_740._8_8_;
        local_380._0_4_ = local_740._0_4_;
        local_380._4_4_ = local_740._4_4_;
        uStack_378._0_4_ = local_740._8_4_;
        uStack_378._4_4_ = local_740._12_4_;
        local_7a0 = (float)local_380 * (float)local_380;
        fStack_79c = local_380._4_4_ * local_380._4_4_;
        fStack_798 = (float)uStack_378 * (float)uStack_378;
        fStack_794 = uStack_378._4_4_ * uStack_378._4_4_;
        local_3a0 = 0x3950696739506967;
        uStack_398 = 0x3950696739506967;
        local_3b0 = local_740._0_8_;
        uStack_3a8 = local_740._8_8_;
        local_660 = CONCAT44(local_380._4_4_ * 0.00019875691,(float)local_380 * 0.00019875691);
        uStack_658 = CONCAT44(uStack_378._4_4_ * 0.00019875691,(float)uStack_378 * 0.00019875691);
        local_670 = 0x3ab743ce;
        uStack_66c = 0x3ab743ce;
        uStack_668 = 0x3ab743ce;
        uStack_664 = 0x3ab743ce;
        local_7b0 = (float)local_380 * 0.00019875691 + 0.0013981999;
        fStack_7ac = local_380._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_7a8 = (float)uStack_378 * 0.00019875691 + 0.0013981999;
        fStack_7a4 = uStack_378._4_4_ * 0.00019875691 + 0.0013981999;
        local_3c0 = CONCAT44(fStack_7ac,local_7b0);
        uStack_3b8 = CONCAT44(fStack_7a4,fStack_7a8);
        local_3d0 = local_740._0_8_;
        uStack_3c8 = local_740._8_8_;
        local_7b0 = local_7b0 * (float)local_380;
        fStack_7ac = fStack_7ac * local_380._4_4_;
        fStack_7a8 = fStack_7a8 * (float)uStack_378;
        fStack_7a4 = fStack_7a4 * uStack_378._4_4_;
        local_680 = CONCAT44(fStack_7ac,local_7b0);
        uStack_678 = CONCAT44(fStack_7a4,fStack_7a8);
        local_690 = 0x3c088908;
        uStack_68c = 0x3c088908;
        uStack_688 = 0x3c088908;
        uStack_684 = 0x3c088908;
        local_7b0 = local_7b0 + 0.008333452;
        fStack_7ac = fStack_7ac + 0.008333452;
        fStack_7a8 = fStack_7a8 + 0.008333452;
        fStack_7a4 = fStack_7a4 + 0.008333452;
        local_3e0 = CONCAT44(fStack_7ac,local_7b0);
        uStack_3d8 = CONCAT44(fStack_7a4,fStack_7a8);
        local_3f0 = local_740._0_8_;
        uStack_3e8 = local_740._8_8_;
        local_7b0 = local_7b0 * (float)local_380;
        fStack_7ac = fStack_7ac * local_380._4_4_;
        fStack_7a8 = fStack_7a8 * (float)uStack_378;
        fStack_7a4 = fStack_7a4 * uStack_378._4_4_;
        local_6a0 = CONCAT44(fStack_7ac,local_7b0);
        uStack_698 = CONCAT44(fStack_7a4,fStack_7a8);
        local_6b0 = 0x3d2aa9c1;
        uStack_6ac = 0x3d2aa9c1;
        uStack_6a8 = 0x3d2aa9c1;
        uStack_6a4 = 0x3d2aa9c1;
        local_7b0 = local_7b0 + 0.041665796;
        fStack_7ac = fStack_7ac + 0.041665796;
        fStack_7a8 = fStack_7a8 + 0.041665796;
        fStack_7a4 = fStack_7a4 + 0.041665796;
        local_400 = CONCAT44(fStack_7ac,local_7b0);
        uStack_3f8 = CONCAT44(fStack_7a4,fStack_7a8);
        local_410 = local_740._0_8_;
        uStack_408 = local_740._8_8_;
        local_7b0 = local_7b0 * (float)local_380;
        fStack_7ac = fStack_7ac * local_380._4_4_;
        fStack_7a8 = fStack_7a8 * (float)uStack_378;
        fStack_7a4 = fStack_7a4 * uStack_378._4_4_;
        local_6c0 = CONCAT44(fStack_7ac,local_7b0);
        uStack_6b8 = CONCAT44(fStack_7a4,fStack_7a8);
        local_6d0 = 0x3e2aaaaa;
        uStack_6cc = 0x3e2aaaaa;
        uStack_6c8 = 0x3e2aaaaa;
        uStack_6c4 = 0x3e2aaaaa;
        local_7b0 = local_7b0 + 0.16666666;
        fStack_7ac = fStack_7ac + 0.16666666;
        fStack_7a8 = fStack_7a8 + 0.16666666;
        fStack_7a4 = fStack_7a4 + 0.16666666;
        local_420 = CONCAT44(fStack_7ac,local_7b0);
        uStack_418 = CONCAT44(fStack_7a4,fStack_7a8);
        local_430 = local_740._0_8_;
        uStack_428 = local_740._8_8_;
        local_7b0 = local_7b0 * (float)local_380;
        fStack_7ac = fStack_7ac * local_380._4_4_;
        fStack_7a8 = fStack_7a8 * (float)uStack_378;
        fStack_7a4 = fStack_7a4 * uStack_378._4_4_;
        local_6e0 = CONCAT44(fStack_7ac,local_7b0);
        uStack_6d8 = CONCAT44(fStack_7a4,fStack_7a8);
        local_6f0 = 0x3f000000;
        uStack_6ec = 0x3f000000;
        uStack_6e8 = 0x3f000000;
        uStack_6e4 = 0x3f000000;
        local_7b0 = local_7b0 + 0.5;
        fStack_7ac = fStack_7ac + 0.5;
        fStack_7a8 = fStack_7a8 + 0.5;
        fStack_7a4 = fStack_7a4 + 0.5;
        local_440 = CONCAT44(fStack_7ac,local_7b0);
        uStack_438 = CONCAT44(fStack_7a4,fStack_7a8);
        local_450 = CONCAT44(fStack_79c,local_7a0);
        uStack_448 = CONCAT44(fStack_794,fStack_798);
        local_7b0 = local_7b0 * local_7a0;
        fStack_7ac = fStack_7ac * fStack_79c;
        fStack_7a8 = fStack_7a8 * fStack_798;
        fStack_7a4 = fStack_7a4 * fStack_794;
        local_700 = CONCAT44(fStack_7ac,local_7b0);
        uStack_6f8 = CONCAT44(fStack_7a4,fStack_7a8);
        local_710 = local_740._0_8_;
        uStack_708 = local_740._8_8_;
        local_7b0 = local_7b0 + (float)local_380;
        fStack_7ac = fStack_7ac + local_380._4_4_;
        fStack_7a8 = fStack_7a8 + (float)uStack_378;
        fStack_7a4 = fStack_7a4 + uStack_378._4_4_;
        local_720 = CONCAT44(fStack_7ac,local_7b0);
        uStack_718 = CONCAT44(fStack_7a4,fStack_7a8);
        local_730 = 0x3f8000003f800000;
        uStack_728 = 0x3f8000003f800000;
        local_7b0 = local_7b0 + 1.0;
        fStack_7ac = fStack_7ac + 1.0;
        fStack_7a8 = fStack_7a8 + 1.0;
        fStack_7a4 = fStack_7a4 + 1.0;
        local_1b0 = local_760;
        uStack_1a8 = uStack_758;
        local_770._4_4_ = (int)local_340._4_4_;
        local_770._0_4_ = (int)(float)local_340;
        local_770._8_4_ = (int)(float)uStack_338;
        local_770._12_4_ = (int)uStack_338._4_4_;
        local_c0 = local_770._0_8_;
        uStack_b8 = local_770._8_8_;
        local_d0 = 0x7f0000007f;
        uStack_c8 = 0x7f0000007f;
        auVar39._8_8_ = local_770._8_8_;
        auVar39._0_8_ = local_770._0_8_;
        auVar38._8_8_ = 0x7f0000007f;
        auVar38._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar39,auVar38);
        local_770._0_8_ = auVar2._0_8_;
        local_80 = local_770._0_8_;
        local_770._8_8_ = auVar2._8_8_;
        uStack_78 = local_770._8_8_;
        local_84 = 0x17;
        local_770 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_50 = local_770._0_8_;
        uStack_48 = local_770._8_8_;
        local_7c0 = local_770._0_8_;
        uStack_7b8 = local_770._8_8_;
        local_460._4_4_ = fStack_7ac;
        local_460._0_4_ = local_7b0;
        local_460._8_4_ = fStack_7a8;
        local_460._12_4_ = fStack_7a4;
        local_470._0_4_ = local_770._0_4_;
        local_470._4_4_ = local_770._4_4_;
        uStack_468._0_4_ = local_770._8_4_;
        uStack_468._4_4_ = local_770._12_4_;
        local_7b0 = local_7b0 * (float)local_470;
        fStack_7ac = fStack_7ac * local_470._4_4_;
        fStack_7a8 = fStack_7a8 * (float)uStack_468;
        fStack_7a4 = fStack_7a4 * uStack_468._4_4_;
        local_970 = CONCAT44(fStack_7ac,local_7b0);
        uStack_968 = CONCAT44(fStack_7a4,fStack_7a8);
        local_9b0 = local_7b0 + 1.0;
        fStack_9ac = fStack_7ac + 1.0;
        fStack_9a8 = fStack_7a8 + 1.0;
        fStack_9a4 = fStack_7a4 + 1.0;
        auVar2._4_4_ = fStack_9ac;
        auVar2._0_4_ = local_9b0;
        auVar2._8_4_ = fStack_9a8;
        auVar2._12_4_ = fStack_9a4;
        local_1e70 = vdivps_avx(local_9a0,auVar2);
        *(undefined1 (*) [16])*local_20e0 = local_1e70;
        local_20e0 = (undefined1 (*) [32])(*local_20e0 + 0x10);
        uStack_9ec = local_9f0;
        uStack_9e8 = local_9f0;
        uStack_9e4 = local_9f0;
        local_960 = local_9a0;
        local_550 = local_1e20;
        uStack_548 = uStack_1e18;
        local_500 = local_530;
        local_470 = local_770._0_8_;
        uStack_468 = local_770._8_8_;
        local_380 = local_390;
        uStack_378 = uStack_388;
        local_340 = local_760;
        uStack_338 = uStack_758;
        local_320 = uVar7;
        uStack_318 = uVar8;
      }
      for (; local_212c < local_1fc0; local_212c = local_212c + 1) {
        dVar47 = std::exp((double)(ulong)(*(uint *)*local_20e0 ^ 0x80000000));
        *(float *)*local_20e0 = 1.0 / (SUB84(dVar47,0) + 1.0);
        local_20e0 = (undefined1 (*) [32])(*local_20e0 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, sigmoid_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, sigmoid_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, sigmoid_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, sigmoid_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));

            ptr++;
        }
    }

    return 0;
}